

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_8_dual_sse2
               (uint8_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined6 uVar8;
  undefined4 uVar9;
  undefined6 uVar10;
  undefined4 uVar11;
  undefined6 uVar12;
  undefined4 uVar13;
  undefined6 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  ulong *puVar37;
  undefined8 *in_RCX;
  ulong *puVar38;
  undefined8 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  byte bVar39;
  short sVar40;
  ushort uVar41;
  short sVar42;
  ushort uVar43;
  ushort uVar44;
  byte bVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  byte bVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  byte bVar60;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  byte bVar65;
  short sVar66;
  ushort uVar67;
  short sVar68;
  ushort uVar69;
  ushort uVar70;
  byte bVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  byte bVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  byte bVar84;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar47 [16];
  ulong uVar45;
  ulong uVar46;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  byte bVar49;
  byte bVar54;
  byte bVar59;
  byte bVar64;
  ulong uVar71;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  byte bVar73;
  byte bVar78;
  byte bVar83;
  byte bVar88;
  undefined1 auVar48 [16];
  ulong uVar72;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i alVar89;
  __m128i alVar90;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  __m128i p1p0;
  __m128i q1q0;
  __m128i q3;
  __m128i p3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i workp_shft2;
  __m128i workp_shft1;
  __m128i workp_shft0;
  __m128i workp_b;
  __m128i workp_a;
  __m128i four;
  __m128i work;
  __m128i abs_p1p0;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i ff;
  __m128i fe;
  __m128i one;
  __m128i pq2;
  __m128i opq2;
  __m128i work_pq;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i p1p0_1;
  __m128i q1q0_1;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i q3p3;
  __m128i q3_16;
  __m128i p3_16;
  __m128i q1_16;
  __m128i q0_16;
  __m128i p0_16;
  __m128i p1_16;
  __m128i q2_16;
  __m128i p2_16;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i zero;
  __m128i ff_1;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_1;
  __m128i filter2filter1;
  __m128i filter;
  __m128i t80;
  __m128i t3t4;
  ulong local_16a8;
  undefined8 uStack_16a0;
  ulong local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  ulong local_1668 [3];
  undefined8 uStack_1650;
  ulong local_1648 [3];
  undefined8 uStack_1630;
  ulong local_1628 [3];
  undefined8 uStack_1610;
  undefined1 local_1608 [16];
  undefined1 local_15f8 [16];
  undefined1 local_15e8 [52];
  int local_15b4;
  ulong *local_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 *local_1530;
  ulong local_1528;
  undefined8 uStack_1520;
  ulong *local_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 *local_14f0;
  ulong local_14e8;
  undefined8 uStack_14e0;
  ulong local_14c8;
  undefined8 uStack_14c0;
  ulong *local_14b0;
  ulong local_14a8;
  undefined8 uStack_14a0;
  ulong *local_1490;
  ulong local_1488;
  undefined8 uStack_1480;
  ulong *local_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 *local_1450;
  byte local_12f8;
  byte bStack_12f7;
  byte bStack_12f6;
  byte bStack_12f5;
  byte bStack_12f4;
  byte bStack_12f3;
  byte bStack_12f2;
  byte bStack_12f1;
  byte bStack_12f0;
  byte bStack_12ef;
  byte bStack_12ee;
  byte bStack_12ed;
  byte bStack_12ec;
  byte bStack_12eb;
  byte bStack_12ea;
  byte bStack_12e9;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined1 local_12c8 [16];
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined1 local_12a8;
  undefined1 uStack_12a7;
  undefined1 uStack_12a6;
  undefined1 uStack_12a5;
  undefined1 uStack_12a4;
  undefined1 uStack_12a3;
  undefined1 uStack_12a2;
  undefined1 uStack_12a1;
  undefined1 uStack_12a0;
  undefined1 uStack_129f;
  undefined1 uStack_129e;
  undefined1 uStack_129d;
  undefined1 uStack_129c;
  undefined1 uStack_129b;
  undefined1 uStack_129a;
  undefined1 uStack_1299;
  ulong local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  ulong local_1228;
  ulong uStack_1220;
  ulong local_1218;
  undefined8 uStack_1210;
  undefined4 local_1208;
  undefined4 uStack_1204;
  undefined8 uStack_1200;
  ulong local_11f8;
  undefined8 uStack_11f0;
  ulong local_11e8;
  ulong uStack_11e0;
  char local_11d8;
  char cStack_11d7;
  char cStack_11d6;
  char cStack_11d5;
  char cStack_11d4;
  char cStack_11d3;
  char cStack_11d2;
  char cStack_11d1;
  char cStack_11d0;
  char cStack_11cf;
  char cStack_11ce;
  char cStack_11cd;
  char cStack_11cc;
  char cStack_11cb;
  char cStack_11ca;
  char cStack_11c9;
  char local_11c8;
  char cStack_11c7;
  char cStack_11c6;
  char cStack_11c5;
  char cStack_11c4;
  char cStack_11c3;
  char cStack_11c2;
  char cStack_11c1;
  char cStack_11c0;
  char cStack_11bf;
  char cStack_11be;
  char cStack_11bd;
  char cStack_11bc;
  char cStack_11bb;
  char cStack_11ba;
  char cStack_11b9;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_1128;
  undefined8 uStack_1120;
  ulong local_1118;
  ulong uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined1 (*local_10e0) [16];
  undefined1 (*local_10d8) [16];
  undefined1 (*local_10d0) [16];
  ulong *local_10c8;
  ulong *local_10c0;
  ulong *local_10b8;
  ulong *local_10b0;
  ulong *local_10a8;
  ulong *local_10a0;
  ulong *local_1098;
  ulong *local_1090;
  undefined8 *local_1088;
  undefined8 *local_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined1 local_1058;
  undefined1 uStack_1057;
  undefined1 uStack_1056;
  undefined1 uStack_1055;
  undefined1 uStack_1054;
  undefined1 uStack_1053;
  undefined1 uStack_1052;
  undefined1 uStack_1051;
  undefined1 local_1038;
  undefined1 uStack_1037;
  undefined1 uStack_1036;
  undefined1 uStack_1035;
  undefined1 uStack_1034;
  undefined1 uStack_1033;
  undefined1 uStack_1032;
  undefined1 uStack_1031;
  undefined1 local_1018;
  undefined1 uStack_1017;
  undefined1 uStack_1016;
  undefined1 uStack_1015;
  undefined1 uStack_1014;
  undefined1 uStack_1013;
  undefined1 uStack_1012;
  undefined1 uStack_1011;
  undefined1 local_ff8;
  undefined1 uStack_ff7;
  undefined1 uStack_ff6;
  undefined1 uStack_ff5;
  undefined1 uStack_ff4;
  undefined1 uStack_ff3;
  undefined1 uStack_ff2;
  undefined1 uStack_ff1;
  undefined1 local_fd8;
  undefined1 uStack_fd7;
  undefined1 uStack_fd6;
  undefined1 uStack_fd5;
  undefined1 uStack_fd4;
  undefined1 uStack_fd3;
  undefined1 uStack_fd2;
  undefined1 uStack_fd1;
  undefined1 local_fb8;
  undefined1 uStack_fb7;
  undefined1 uStack_fb6;
  undefined1 uStack_fb5;
  undefined1 uStack_fb4;
  undefined1 uStack_fb3;
  undefined1 uStack_fb2;
  undefined1 uStack_fb1;
  undefined1 local_f98;
  undefined1 uStack_f97;
  undefined1 uStack_f96;
  undefined1 uStack_f95;
  undefined1 uStack_f94;
  undefined1 uStack_f93;
  undefined1 uStack_f92;
  undefined1 uStack_f91;
  undefined1 local_f78;
  undefined1 uStack_f77;
  undefined1 uStack_f76;
  undefined1 uStack_f75;
  undefined1 uStack_f74;
  undefined1 uStack_f73;
  undefined1 uStack_f72;
  undefined1 uStack_f71;
  ulong local_f48;
  ulong uStack_f40;
  ulong local_f38;
  ulong uStack_f30;
  ulong local_f08;
  undefined8 uStack_f00;
  ulong local_ef8;
  ulong uStack_ef0;
  ulong local_ee8;
  undefined8 uStack_ee0;
  ulong local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  ulong local_eb8;
  undefined8 uStack_eb0;
  ulong local_ea8;
  undefined8 uStack_ea0;
  ulong local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined1 local_e5a;
  undefined1 local_e59;
  char local_e48;
  char cStack_e47;
  char cStack_e46;
  char cStack_e45;
  char cStack_e44;
  char cStack_e43;
  char cStack_e42;
  char cStack_e41;
  char local_e38;
  char cStack_e37;
  char cStack_e36;
  char cStack_e35;
  char cStack_e34;
  char cStack_e33;
  char cStack_e32;
  char cStack_e31;
  char cStack_e30;
  char cStack_e2f;
  char cStack_e2e;
  char cStack_e2d;
  char cStack_e2c;
  char cStack_e2b;
  char cStack_e2a;
  char cStack_e29;
  char local_e28;
  char cStack_e27;
  char cStack_e26;
  char cStack_e25;
  char cStack_e24;
  char cStack_e23;
  char cStack_e22;
  char cStack_e21;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  ulong local_db8;
  undefined8 uStack_db0;
  ulong local_da8;
  undefined8 uStack_da0;
  byte local_d68;
  byte bStack_d67;
  byte bStack_d66;
  byte bStack_d65;
  byte bStack_d64;
  byte bStack_d63;
  byte bStack_d62;
  byte bStack_d61;
  byte bStack_d60;
  byte bStack_d5f;
  byte bStack_d5e;
  byte bStack_d5d;
  byte bStack_d5c;
  byte bStack_d5b;
  byte bStack_d5a;
  byte bStack_d59;
  byte local_d58;
  byte bStack_d57;
  byte bStack_d56;
  byte bStack_d55;
  byte bStack_d54;
  byte bStack_d53;
  byte bStack_d52;
  byte bStack_d51;
  byte bStack_d50;
  byte bStack_d4f;
  byte bStack_d4e;
  byte bStack_d4d;
  byte bStack_d4c;
  byte bStack_d4b;
  byte bStack_d4a;
  byte bStack_d49;
  byte local_d48;
  byte bStack_d47;
  byte bStack_d46;
  byte bStack_d45;
  byte bStack_d44;
  byte bStack_d43;
  byte bStack_d42;
  byte bStack_d41;
  byte bStack_d40;
  byte bStack_d3f;
  byte bStack_d3e;
  byte bStack_d3d;
  byte bStack_d3c;
  byte bStack_d3b;
  byte bStack_d3a;
  byte bStack_d39;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  byte local_cf8;
  byte bStack_cf7;
  byte bStack_cf6;
  byte bStack_cf5;
  byte bStack_cf4;
  byte bStack_cf3;
  byte bStack_cf2;
  byte bStack_cf1;
  byte bStack_cf0;
  byte bStack_cef;
  byte bStack_cee;
  byte bStack_ced;
  byte bStack_cec;
  byte bStack_ceb;
  byte bStack_cea;
  byte bStack_ce9;
  byte local_ce8;
  byte bStack_ce7;
  byte bStack_ce6;
  byte bStack_ce5;
  byte bStack_ce4;
  byte bStack_ce3;
  byte bStack_ce2;
  byte bStack_ce1;
  byte bStack_ce0;
  byte bStack_cdf;
  byte bStack_cde;
  byte bStack_cdd;
  byte bStack_cdc;
  byte bStack_cdb;
  byte bStack_cda;
  byte bStack_cd9;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  ulong local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined4 local_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  ulong local_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined1 local_a88 [16];
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  char local_a48;
  char cStack_a47;
  char cStack_a46;
  char cStack_a45;
  char cStack_a44;
  char cStack_a43;
  char cStack_a42;
  char cStack_a41;
  char cStack_a40;
  char cStack_a3f;
  char cStack_a3e;
  char cStack_a3d;
  char cStack_a3c;
  char cStack_a3b;
  char cStack_a3a;
  char cStack_a39;
  ulong local_a38;
  ulong uStack_a30;
  char local_a28;
  char cStack_a27;
  char cStack_a26;
  char cStack_a25;
  char cStack_a24;
  char cStack_a23;
  char cStack_a22;
  char cStack_a21;
  char cStack_a20;
  char cStack_a1f;
  char cStack_a1e;
  char cStack_a1d;
  char cStack_a1c;
  char cStack_a1b;
  char cStack_a1a;
  char cStack_a19;
  uint local_9a8;
  uint uStack_9a4;
  uint uStack_9a0;
  uint uStack_99c;
  uint local_998;
  uint uStack_994;
  uint uStack_990;
  uint uStack_98c;
  short sStack_916;
  short sStack_914;
  short sStack_912;
  short sStack_90e;
  short sStack_90c;
  short sStack_90a;
  short sStack_8f6;
  short sStack_8f4;
  short sStack_8f2;
  short sStack_8ee;
  short sStack_8ec;
  short sStack_8ea;
  short sStack_8b6;
  short sStack_8b4;
  short sStack_8b2;
  short sStack_8ae;
  short sStack_8ac;
  short sStack_8aa;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  short sStack_836;
  short sStack_834;
  short sStack_832;
  short sStack_82e;
  short sStack_82c;
  short sStack_82a;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  short sStack_7d6;
  short sStack_7d4;
  short sStack_7d2;
  short sStack_7ce;
  short sStack_7cc;
  short sStack_7ca;
  short sStack_796;
  short sStack_794;
  short sStack_792;
  short sStack_78e;
  short sStack_78c;
  short sStack_78a;
  short sStack_776;
  short sStack_774;
  short sStack_772;
  short sStack_76e;
  short sStack_76c;
  short sStack_76a;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  short sStack_716;
  short sStack_714;
  short sStack_712;
  short sStack_70e;
  short sStack_70c;
  short sStack_70a;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  short sStack_6fe;
  short sStack_6fc;
  short sStack_6fa;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  short sStack_6ee;
  short sStack_6ec;
  short sStack_6ea;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  short sStack_68e;
  short sStack_68c;
  short sStack_68a;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_67e;
  short sStack_67c;
  short sStack_67a;
  short sStack_666;
  short sStack_664;
  short sStack_662;
  short sStack_65e;
  short sStack_65c;
  short sStack_65a;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  short sStack_636;
  short sStack_634;
  short sStack_632;
  short sStack_62e;
  short sStack_62c;
  short sStack_62a;
  short sStack_616;
  short sStack_614;
  short sStack_612;
  short sStack_60e;
  short sStack_60c;
  short sStack_60a;
  short sStack_5f6;
  short sStack_5f4;
  short sStack_5f2;
  short sStack_5ee;
  short sStack_5ec;
  short sStack_5ea;
  short sStack_5d6;
  short sStack_5d4;
  short sStack_5d2;
  short sStack_5ce;
  short sStack_5cc;
  short sStack_5ca;
  short sStack_5b6;
  short sStack_5b4;
  short sStack_5b2;
  short sStack_5ae;
  short sStack_5ac;
  short sStack_5aa;
  short sStack_596;
  short sStack_594;
  short sStack_592;
  short sStack_58e;
  short sStack_58c;
  short sStack_58a;
  short sStack_576;
  short sStack_574;
  short sStack_572;
  short sStack_56e;
  short sStack_56c;
  short sStack_56a;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined1 local_548;
  undefined1 local_547;
  undefined1 local_546;
  undefined1 local_545;
  undefined1 local_544;
  undefined1 local_543;
  undefined1 local_542;
  undefined1 local_541;
  undefined1 local_540;
  undefined1 local_53f;
  undefined1 local_53e;
  undefined1 local_53d;
  undefined1 local_53c;
  undefined1 local_53b;
  undefined1 local_53a;
  undefined1 local_539;
  ulong local_538;
  undefined8 uStack_530;
  undefined1 local_528;
  undefined1 local_527;
  undefined1 local_526;
  undefined1 local_525;
  undefined1 local_524;
  undefined1 local_523;
  undefined1 local_522;
  undefined1 local_521;
  undefined1 local_520;
  undefined1 local_51f;
  undefined1 local_51e;
  undefined1 local_51d;
  undefined1 local_51c;
  undefined1 local_51b;
  undefined1 local_51a;
  undefined1 local_519;
  ulong local_4b8;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined1 local_498;
  undefined1 uStack_497;
  undefined1 uStack_496;
  undefined1 uStack_495;
  undefined1 uStack_494;
  undefined1 uStack_493;
  undefined1 uStack_492;
  undefined1 uStack_491;
  undefined1 uStack_490;
  undefined1 uStack_48f;
  undefined1 uStack_48e;
  undefined1 uStack_48d;
  undefined1 uStack_48c;
  undefined1 uStack_48b;
  undefined1 uStack_48a;
  undefined1 uStack_489;
  undefined8 local_488;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  ulong local_428;
  ulong uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  ulong *local_408;
  ulong *local_400;
  undefined8 *local_3f8;
  ulong *local_3f0;
  ulong *local_3e8;
  ulong *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined1 local_349;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  undefined8 uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong uStack_290;
  ulong local_288;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  undefined8 local_268;
  ulong uStack_260;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  
  local_15b4 = (int)in_RSI;
  uVar1 = *in_RDX;
  uStack_1550 = in_RDX[1];
  uVar2 = *in_R9;
  uStack_1560 = in_R9[1];
  local_1558._0_4_ = (undefined4)uVar1;
  local_1558._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_1568._0_4_ = (undefined4)uVar2;
  local_1568._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_15e8._0_4_ = (undefined4)local_1558;
  local_15e8._4_4_ = (undefined4)local_1568;
  local_15e8._8_4_ = local_1558._4_4_;
  local_15e8._12_4_ = local_1568._4_4_;
  uVar3 = *in_RCX;
  uStack_1570 = in_RCX[1];
  uVar4 = *in_stack_00000008;
  uStack_1580 = in_stack_00000008[1];
  local_1578._0_4_ = (undefined4)uVar3;
  local_1578._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_1588._0_4_ = (undefined4)uVar4;
  local_1588._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_15f8._0_4_ = (undefined4)local_1578;
  local_15f8._4_4_ = (undefined4)local_1588;
  local_15f8._8_4_ = local_1578._4_4_;
  local_15f8._12_4_ = local_1588._4_4_;
  uVar5 = *in_R8;
  uStack_1590 = in_R8[1];
  uVar6 = *in_stack_00000010;
  uStack_15a0 = in_stack_00000010[1];
  local_1598._0_4_ = (undefined4)uVar5;
  local_1598._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  local_15a8._0_4_ = (undefined4)uVar6;
  local_15a8._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
  local_1608._0_4_ = (undefined4)local_1598;
  local_1608._4_4_ = (undefined4)local_15a8;
  local_1608._8_4_ = local_1598._4_4_;
  local_1608._12_4_ = local_15a8._4_4_;
  local_1450 = (undefined8 *)((long)in_RDI - (long)(local_15b4 << 2));
  local_1678 = *local_1450;
  uStack_1460 = 0;
  uStack_1670 = 0;
  local_1470 = (ulong *)((long)in_RDI - (long)(local_15b4 * 3));
  local_1628[2] = *local_1470;
  uStack_1480 = 0;
  uStack_1610 = 0;
  local_1490 = (ulong *)((long)in_RDI - (long)(local_15b4 * 2));
  local_1628[0] = *local_1490;
  uStack_14a0 = 0;
  local_1628[1] = 0;
  local_14b0 = (ulong *)((long)in_RDI - (long)local_15b4);
  local_1648[2] = *local_14b0;
  uStack_14c0 = 0;
  uStack_1630 = 0;
  local_1648[0] = *in_RDI;
  uStack_14e0 = 0;
  local_1648[1] = 0;
  local_14f0 = (undefined8 *)((long)in_RDI + (long)local_15b4);
  local_1668[2] = *local_14f0;
  uStack_1500 = 0;
  uStack_1650 = 0;
  local_1510 = (ulong *)((long)in_RDI + (long)(local_15b4 * 2));
  local_1668[0] = *local_1510;
  uStack_1520 = 0;
  local_1668[1] = 0;
  alVar90[0] = in_RSI & 0xffffffff;
  alVar90[1] = (long)(local_15b4 * 3);
  local_1530 = (undefined8 *)((long)in_RDI + alVar90[1]);
  local_1688 = *local_1530;
  uStack_1540 = 0;
  uStack_1680 = 0;
  local_1080 = &local_1678;
  local_1088 = &local_1688;
  local_1090 = local_1628 + 2;
  local_1098 = local_1668;
  local_10a0 = local_1628;
  local_10a8 = local_1668 + 2;
  local_10b0 = local_1648 + 2;
  local_10b8 = local_1648;
  local_10c0 = &local_1698;
  local_10c8 = &local_16a8;
  local_10d0 = (undefined1 (*) [16])local_15e8;
  local_10d8 = &local_15f8;
  local_10e0 = &local_1608;
  local_1078 = 0;
  uStack_1070 = 0;
  local_10f8 = 0;
  uStack_10f0 = 0;
  uStack_e70 = 0;
  uStack_e80 = 0;
  uStack_e90 = 0;
  uStack_ea0 = 0;
  uStack_eb0 = 0;
  uStack_ec0 = 0;
  uStack_ed0 = 0;
  uStack_ee0 = 0;
  uStack_1200._4_4_ = (undefined4)(local_1648[0] >> 0x20);
  uStack_11f0._4_4_ = (undefined4)(local_1668[2] >> 0x20);
  local_11e8._0_4_ = (undefined4)local_1628[2];
  uStack_49c = uStack_1200._4_4_;
  local_498 = (undefined1)local_1628[0];
  uStack_497 = (undefined1)(local_1628[0] >> 8);
  uStack_496 = (undefined1)(local_1628[0] >> 0x10);
  uStack_495 = (undefined1)(local_1628[0] >> 0x18);
  uStack_4ac = uStack_11f0._4_4_;
  _local_4a8 = CONCAT44((int)(local_1648[2] >> 0x20),(undefined4)local_11e8);
  uStack_1210 = CONCAT44(uStack_1200._4_4_,uStack_4a0);
  _local_1208 = CONCAT44(uStack_11f0._4_4_,uStack_4b0);
  local_e59 = 1;
  local_539 = 1;
  local_53a = 1;
  local_53b = 1;
  local_53c = 1;
  local_53d = 1;
  local_53e = 1;
  local_53f = 1;
  local_540 = 1;
  local_541 = 1;
  local_542 = 1;
  local_543 = 1;
  local_544 = 1;
  local_545 = 1;
  local_546 = 1;
  local_547 = 1;
  local_548 = 1;
  local_1288 = 0x101010101010101;
  uStack_1280 = 0x101010101010101;
  local_e5a = 0xfe;
  local_519 = 0xfe;
  local_51a = 0xfe;
  local_51b = 0xfe;
  local_51c = 0xfe;
  local_51d = 0xfe;
  local_51e = 0xfe;
  local_51f = 0xfe;
  local_520 = 0xfe;
  local_521 = 0xfe;
  local_522 = 0xfe;
  local_523 = 0xfe;
  local_524 = 0xfe;
  local_525 = 0xfe;
  local_526 = 0xfe;
  local_527 = 0xfe;
  local_528 = 0xfe;
  local_1298 = 0xfefefefefefefefe;
  uStack_1290 = 0xfefefefefefefefe;
  local_12a8 = 0xff;
  uStack_12a7 = 0xff;
  uStack_12a6 = 0xff;
  uStack_12a5 = 0xff;
  uStack_12a4 = 0xff;
  uStack_12a3 = 0xff;
  uStack_12a2 = 0xff;
  uStack_12a1 = 0xff;
  uStack_12a0 = 0xff;
  uStack_129f = 0xff;
  uStack_129e = 0xff;
  uStack_129d = 0xff;
  uStack_129c = 0xff;
  uStack_129b = 0xff;
  uStack_129a = 0xff;
  uStack_1299 = 0xff;
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  local_15b0 = in_RDI;
  local_15a8 = uVar6;
  local_1598 = uVar5;
  local_1588 = uVar4;
  local_1578 = uVar3;
  local_1568 = uVar2;
  local_1558 = uVar1;
  local_1548 = local_1688;
  local_1528 = local_1668[0];
  local_1508 = local_1668[2];
  local_14e8 = local_1648[0];
  local_14c8 = local_1648[2];
  local_14a8 = local_1628[0];
  local_1488 = local_1628[2];
  local_1468 = local_1678;
  local_1228 = local_1648[2];
  uStack_1220 = local_1628[0];
  uStack_1200 = local_1648[0];
  local_11f8 = local_1628[0];
  uStack_11f0 = local_1668[2];
  local_11e8 = local_1628[2];
  uStack_11e0 = local_1668[0];
  local_11b8 = local_1678;
  uStack_11b0 = local_1688;
  local_f08 = local_1628[0];
  uStack_f00 = local_1668[2];
  local_ef8 = local_1648[2];
  uStack_ef0 = local_1648[0];
  local_ee8 = local_1648[0];
  local_ed8 = local_1648[2];
  local_ec8 = local_1668[2];
  local_eb8 = local_1628[0];
  local_ea8 = local_1668[0];
  local_e98 = local_1628[2];
  local_e88 = local_1688;
  local_e78 = local_1678;
  local_db8 = local_1298;
  uStack_db0 = uStack_1290;
  local_da8 = local_1298;
  uStack_da0 = uStack_1290;
  local_558 = local_1288;
  uStack_550 = uStack_1280;
  local_538 = local_1298;
  uStack_530 = uStack_1290;
  local_4b8 = local_1628[0];
  alVar89 = abs_diff(a,alVar90);
  alVar89[0] = alVar89[1];
  uStack_12d0 = 0;
  alVar89[1] = alVar90[1];
  a_00[1] = in_RSI;
  a_00[0] = (longlong)in_RDI;
  local_12e8 = extraout_XMM0_Qa;
  uStack_12e0 = extraout_XMM0_Qb;
  local_12d8 = extraout_XMM0_Qb;
  alVar89 = abs_diff(a_00,alVar89);
  b[0] = alVar89[1];
  local_ca8 = local_12e8;
  uVar35 = local_ca8;
  uStack_ca0 = uStack_12e0;
  uVar36 = uStack_ca0;
  local_cb8 = local_12d8;
  uVar6 = local_cb8;
  uStack_cb0 = uStack_12d0;
  uVar34 = uStack_cb0;
  local_ca8._0_1_ = (byte)local_12e8;
  local_ca8._1_1_ = (byte)((ulong)local_12e8 >> 8);
  local_ca8._2_1_ = (byte)((ulong)local_12e8 >> 0x10);
  local_ca8._3_1_ = (byte)((ulong)local_12e8 >> 0x18);
  local_ca8._4_1_ = (byte)((ulong)local_12e8 >> 0x20);
  local_ca8._5_1_ = (byte)((ulong)local_12e8 >> 0x28);
  local_ca8._6_1_ = (byte)((ulong)local_12e8 >> 0x30);
  local_ca8._7_1_ = (byte)((ulong)local_12e8 >> 0x38);
  uStack_ca0._0_1_ = (byte)uStack_12e0;
  uStack_ca0._1_1_ = (byte)((ulong)uStack_12e0 >> 8);
  uStack_ca0._2_1_ = (byte)((ulong)uStack_12e0 >> 0x10);
  uStack_ca0._3_1_ = (byte)((ulong)uStack_12e0 >> 0x18);
  uStack_ca0._4_1_ = (byte)((ulong)uStack_12e0 >> 0x20);
  uStack_ca0._5_1_ = (byte)((ulong)uStack_12e0 >> 0x28);
  uStack_ca0._6_1_ = (byte)((ulong)uStack_12e0 >> 0x30);
  uStack_ca0._7_1_ = (byte)((ulong)uStack_12e0 >> 0x38);
  local_cb8._0_1_ = (byte)local_12d8;
  local_cb8._1_1_ = (byte)((ulong)local_12d8 >> 8);
  local_cb8._2_1_ = (byte)((ulong)local_12d8 >> 0x10);
  local_cb8._3_1_ = (byte)((ulong)local_12d8 >> 0x18);
  local_cb8._4_1_ = (byte)((ulong)local_12d8 >> 0x20);
  local_cb8._5_1_ = (byte)((ulong)local_12d8 >> 0x28);
  local_cb8._6_1_ = (byte)((ulong)local_12d8 >> 0x30);
  local_cb8._7_1_ = (byte)((ulong)local_12d8 >> 0x38);
  uStack_cb0._0_1_ = (byte)uStack_12d0;
  uStack_cb0._1_1_ = (byte)((ulong)uStack_12d0 >> 8);
  uStack_cb0._2_1_ = (byte)((ulong)uStack_12d0 >> 0x10);
  uStack_cb0._3_1_ = (byte)((ulong)uStack_12d0 >> 0x18);
  uStack_cb0._4_1_ = (byte)((ulong)uStack_12d0 >> 0x20);
  uStack_cb0._5_1_ = (byte)((ulong)uStack_12d0 >> 0x28);
  uStack_cb0._6_1_ = (byte)((ulong)uStack_12d0 >> 0x30);
  uStack_cb0._7_1_ = (byte)((ulong)uStack_12d0 >> 0x38);
  local_1128._0_2_ =
       CONCAT11((local_ca8._1_1_ < local_cb8._1_1_) * local_cb8._1_1_ |
                (local_ca8._1_1_ >= local_cb8._1_1_) * local_ca8._1_1_,
                ((byte)local_ca8 < (byte)local_cb8) * (byte)local_cb8 |
                ((byte)local_ca8 >= (byte)local_cb8) * (byte)local_ca8);
  local_1128._0_3_ =
       CONCAT12((local_ca8._2_1_ < local_cb8._2_1_) * local_cb8._2_1_ |
                (local_ca8._2_1_ >= local_cb8._2_1_) * local_ca8._2_1_,(undefined2)local_1128);
  local_1128._0_4_ =
       CONCAT13((local_ca8._3_1_ < local_cb8._3_1_) * local_cb8._3_1_ |
                (local_ca8._3_1_ >= local_cb8._3_1_) * local_ca8._3_1_,(undefined3)local_1128);
  local_1128._0_5_ =
       CONCAT14((local_ca8._4_1_ < local_cb8._4_1_) * local_cb8._4_1_ |
                (local_ca8._4_1_ >= local_cb8._4_1_) * local_ca8._4_1_,(undefined4)local_1128);
  local_1128._0_6_ =
       CONCAT15((local_ca8._5_1_ < local_cb8._5_1_) * local_cb8._5_1_ |
                (local_ca8._5_1_ >= local_cb8._5_1_) * local_ca8._5_1_,(undefined5)local_1128);
  local_1128._0_7_ =
       CONCAT16((local_ca8._6_1_ < local_cb8._6_1_) * local_cb8._6_1_ |
                (local_ca8._6_1_ >= local_cb8._6_1_) * local_ca8._6_1_,(undefined6)local_1128);
  local_1128 = CONCAT17((local_ca8._7_1_ < local_cb8._7_1_) * local_cb8._7_1_ |
                        (local_ca8._7_1_ >= local_cb8._7_1_) * local_ca8._7_1_,
                        (undefined7)local_1128);
  uStack_1120._0_1_ =
       ((byte)uStack_ca0 < (byte)uStack_cb0) * (byte)uStack_cb0 |
       ((byte)uStack_ca0 >= (byte)uStack_cb0) * (byte)uStack_ca0;
  uStack_1120._1_1_ =
       (uStack_ca0._1_1_ < uStack_cb0._1_1_) * uStack_cb0._1_1_ |
       (uStack_ca0._1_1_ >= uStack_cb0._1_1_) * uStack_ca0._1_1_;
  uStack_1120._2_1_ =
       (uStack_ca0._2_1_ < uStack_cb0._2_1_) * uStack_cb0._2_1_ |
       (uStack_ca0._2_1_ >= uStack_cb0._2_1_) * uStack_ca0._2_1_;
  uStack_1120._3_1_ =
       (uStack_ca0._3_1_ < uStack_cb0._3_1_) * uStack_cb0._3_1_ |
       (uStack_ca0._3_1_ >= uStack_cb0._3_1_) * uStack_ca0._3_1_;
  uStack_1120._4_1_ =
       (uStack_ca0._4_1_ < uStack_cb0._4_1_) * uStack_cb0._4_1_ |
       (uStack_ca0._4_1_ >= uStack_cb0._4_1_) * uStack_ca0._4_1_;
  uStack_1120._5_1_ =
       (uStack_ca0._5_1_ < uStack_cb0._5_1_) * uStack_cb0._5_1_ |
       (uStack_ca0._5_1_ >= uStack_cb0._5_1_) * uStack_ca0._5_1_;
  uStack_1120._6_1_ =
       (uStack_ca0._6_1_ < uStack_cb0._6_1_) * uStack_cb0._6_1_ |
       (uStack_ca0._6_1_ >= uStack_cb0._6_1_) * uStack_ca0._6_1_;
  uStack_1120._7_1_ =
       (uStack_ca0._7_1_ < uStack_cb0._7_1_) * uStack_cb0._7_1_ |
       (uStack_ca0._7_1_ >= uStack_cb0._7_1_) * uStack_ca0._7_1_;
  local_a78 = *(undefined8 *)*local_10e0;
  uStack_a70 = *(undefined8 *)(*local_10e0 + 8);
  local_a68 = local_1128;
  uStack_a60 = uStack_1120;
  auVar19._8_8_ = uStack_1120;
  auVar19._0_8_ = local_1128;
  auVar47 = psubusb(auVar19,*local_10e0);
  local_1118 = auVar47._0_8_;
  uStack_1110 = auVar47._8_8_;
  local_dc8 = local_1118;
  uVar72 = local_dc8;
  uStack_dc0 = uStack_1110;
  uVar5 = uStack_dc0;
  local_dd8 = local_10f8;
  uVar3 = local_dd8;
  uStack_dd0 = uStack_10f0;
  uVar4 = uStack_dd0;
  local_dc8._0_1_ = auVar47[0];
  local_dc8._1_1_ = auVar47[1];
  local_dc8._2_1_ = auVar47[2];
  local_dc8._3_1_ = auVar47[3];
  local_dc8._4_1_ = auVar47[4];
  local_dc8._5_1_ = auVar47[5];
  local_dc8._6_1_ = auVar47[6];
  local_dc8._7_1_ = auVar47[7];
  uStack_dc0._0_1_ = auVar47[8];
  uStack_dc0._1_1_ = auVar47[9];
  uStack_dc0._2_1_ = auVar47[10];
  uStack_dc0._3_1_ = auVar47[0xb];
  uStack_dc0._4_1_ = auVar47[0xc];
  uStack_dc0._5_1_ = auVar47[0xd];
  uStack_dc0._6_1_ = auVar47[0xe];
  uStack_dc0._7_1_ = auVar47[0xf];
  local_dd8._0_1_ = (char)local_10f8;
  local_dd8._1_1_ = (char)((ulong)local_10f8 >> 8);
  local_dd8._2_1_ = (char)((ulong)local_10f8 >> 0x10);
  local_dd8._3_1_ = (char)((ulong)local_10f8 >> 0x18);
  local_dd8._4_1_ = (char)((ulong)local_10f8 >> 0x20);
  local_dd8._5_1_ = (char)((ulong)local_10f8 >> 0x28);
  local_dd8._6_1_ = (char)((ulong)local_10f8 >> 0x30);
  local_dd8._7_1_ = (char)((ulong)local_10f8 >> 0x38);
  uStack_dd0._0_1_ = (char)uStack_10f0;
  uStack_dd0._1_1_ = (char)((ulong)uStack_10f0 >> 8);
  uStack_dd0._2_1_ = (char)((ulong)uStack_10f0 >> 0x10);
  uStack_dd0._3_1_ = (char)((ulong)uStack_10f0 >> 0x18);
  uStack_dd0._4_1_ = (char)((ulong)uStack_10f0 >> 0x20);
  uStack_dd0._5_1_ = (char)((ulong)uStack_10f0 >> 0x28);
  uStack_dd0._6_1_ = (char)((ulong)uStack_10f0 >> 0x30);
  uStack_dd0._7_1_ = (char)((ulong)uStack_10f0 >> 0x38);
  local_a28 = -((char)local_dc8 == (char)local_dd8);
  cStack_a27 = -(local_dc8._1_1_ == local_dd8._1_1_);
  cStack_a26 = -(local_dc8._2_1_ == local_dd8._2_1_);
  cStack_a25 = -(local_dc8._3_1_ == local_dd8._3_1_);
  cStack_a24 = -(local_dc8._4_1_ == local_dd8._4_1_);
  cStack_a23 = -(local_dc8._5_1_ == local_dd8._5_1_);
  cStack_a22 = -(local_dc8._6_1_ == local_dd8._6_1_);
  cStack_a21 = -(local_dc8._7_1_ == local_dd8._7_1_);
  cStack_a20 = -((char)uStack_dc0 == (char)uStack_dd0);
  cStack_a1f = -(uStack_dc0._1_1_ == uStack_dd0._1_1_);
  cStack_a1e = -(uStack_dc0._2_1_ == uStack_dd0._2_1_);
  cStack_a1d = -(uStack_dc0._3_1_ == uStack_dd0._3_1_);
  cStack_a1c = -(uStack_dc0._4_1_ == uStack_dd0._4_1_);
  cStack_a1b = -(uStack_dc0._5_1_ == uStack_dd0._5_1_);
  cStack_a1a = -(uStack_dc0._6_1_ == uStack_dd0._6_1_);
  cStack_a19 = -(uStack_dc0._7_1_ == uStack_dd0._7_1_);
  local_a38 = CONCAT17(uStack_12a1,
                       CONCAT16(uStack_12a2,
                                CONCAT15(uStack_12a3,
                                         CONCAT14(uStack_12a4,
                                                  CONCAT13(uStack_12a5,
                                                           CONCAT12(uStack_12a6,
                                                                    CONCAT11(uStack_12a7,local_12a8)
                                                                   ))))));
  uStack_a30 = CONCAT17(uStack_1299,
                        CONCAT16(uStack_129a,
                                 CONCAT15(uStack_129b,
                                          CONCAT14(uStack_129c,
                                                   CONCAT13(uStack_129d,
                                                            CONCAT12(uStack_129e,
                                                                     CONCAT11(uStack_129f,
                                                                              uStack_12a0)))))));
  local_f48 = CONCAT17(cStack_a21,
                       CONCAT16(cStack_a22,
                                CONCAT15(cStack_a23,
                                         CONCAT14(cStack_a24,
                                                  CONCAT13(cStack_a25,
                                                           CONCAT12(cStack_a26,
                                                                    CONCAT11(cStack_a27,local_a28)))
                                                 )))) ^ local_a38;
  uStack_f40 = CONCAT17(cStack_a19,
                        CONCAT16(cStack_a1a,
                                 CONCAT15(cStack_a1b,
                                          CONCAT14(cStack_a1c,
                                                   CONCAT13(cStack_a1d,
                                                            CONCAT12(cStack_a1e,
                                                                     CONCAT11(cStack_a1f,cStack_a20)
                                                                    )))))) ^ uStack_a30;
  auVar15._8_8_ = extraout_XMM0_Qa_00;
  auVar15._0_8_ = extraout_XMM0_Qa_00;
  auVar48._8_8_ = extraout_XMM0_Qa_00;
  auVar48._0_8_ = extraout_XMM0_Qa_00;
  local_12c8 = paddusb(auVar15,auVar48);
  uStack_ae0 = 0;
  local_af8 = local_1298;
  uStack_af0 = uStack_1290;
  uVar45 = extraout_XMM0_Qb_00 & local_1298;
  uStack_b80 = 0;
  local_b8c = 1;
  local_b88._0_2_ = (ushort)uVar45;
  local_b88._2_2_ = (ushort)(uVar45 >> 0x10);
  local_b88._4_2_ = (ushort)(uVar45 >> 0x20);
  local_12b8 = CONCAT26((ushort)(uVar45 >> 0x31),
                        CONCAT24(local_b88._4_2_ >> 1,
                                 CONCAT22(local_b88._2_2_ >> 1,(ushort)local_b88 >> 1)));
  uStack_12b0 = 0;
  local_c88 = local_12c8._0_8_;
  uStack_c80 = local_12c8._8_8_;
  local_c98 = local_12b8;
  uStack_c90 = 0;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_12b8;
  local_a88 = paddusb(local_12c8,auVar47);
  local_a98 = *(undefined8 *)*local_10d0;
  uStack_a90 = *(undefined8 *)(*local_10d0 + 8);
  auVar47 = psubusb(local_a88,*local_10d0);
  local_1108 = auVar47._0_8_;
  uStack_1100 = auVar47._8_8_;
  local_de8 = local_1108;
  uVar1 = local_de8;
  uStack_de0 = uStack_1100;
  uVar2 = uStack_de0;
  local_df8 = local_10f8;
  uStack_df0 = uStack_10f0;
  local_de8._0_1_ = auVar47[0];
  local_de8._1_1_ = auVar47[1];
  local_de8._2_1_ = auVar47[2];
  local_de8._3_1_ = auVar47[3];
  local_de8._4_1_ = auVar47[4];
  local_de8._5_1_ = auVar47[5];
  local_de8._6_1_ = auVar47[6];
  local_de8._7_1_ = auVar47[7];
  uStack_de0._0_1_ = auVar47[8];
  uStack_de0._1_1_ = auVar47[9];
  uStack_de0._2_1_ = auVar47[10];
  uStack_de0._3_1_ = auVar47[0xb];
  uStack_de0._4_1_ = auVar47[0xc];
  uStack_de0._5_1_ = auVar47[0xd];
  uStack_de0._6_1_ = auVar47[0xe];
  uStack_de0._7_1_ = auVar47[0xf];
  local_a48 = -((char)local_de8 == (char)local_dd8);
  cStack_a47 = -(local_de8._1_1_ == local_dd8._1_1_);
  cStack_a46 = -(local_de8._2_1_ == local_dd8._2_1_);
  cStack_a45 = -(local_de8._3_1_ == local_dd8._3_1_);
  cStack_a44 = -(local_de8._4_1_ == local_dd8._4_1_);
  cStack_a43 = -(local_de8._5_1_ == local_dd8._5_1_);
  cStack_a42 = -(local_de8._6_1_ == local_dd8._6_1_);
  cStack_a41 = -(local_de8._7_1_ == local_dd8._7_1_);
  cStack_a40 = -((char)uStack_de0 == (char)uStack_dd0);
  cStack_a3f = -(uStack_de0._1_1_ == uStack_dd0._1_1_);
  cStack_a3e = -(uStack_de0._2_1_ == uStack_dd0._2_1_);
  cStack_a3d = -(uStack_de0._3_1_ == uStack_dd0._3_1_);
  cStack_a3c = -(uStack_de0._4_1_ == uStack_dd0._4_1_);
  cStack_a3b = -(uStack_de0._5_1_ == uStack_dd0._5_1_);
  cStack_a3a = -(uStack_de0._6_1_ == uStack_dd0._6_1_);
  cStack_a39 = -(uStack_de0._7_1_ == uStack_dd0._7_1_);
  local_a58 = CONCAT17(uStack_12a1,
                       CONCAT16(uStack_12a2,
                                CONCAT15(uStack_12a3,
                                         CONCAT14(uStack_12a4,
                                                  CONCAT13(uStack_12a5,
                                                           CONCAT12(uStack_12a6,
                                                                    CONCAT11(uStack_12a7,local_12a8)
                                                                   ))))));
  uStack_a50 = CONCAT17(uStack_1299,
                        CONCAT16(uStack_129a,
                                 CONCAT15(uStack_129b,
                                          CONCAT14(uStack_129c,
                                                   CONCAT13(uStack_129d,
                                                            CONCAT12(uStack_129e,
                                                                     CONCAT11(uStack_129f,
                                                                              uStack_12a0)))))));
  uVar46 = CONCAT17(cStack_a41,
                    CONCAT16(cStack_a42,
                             CONCAT15(cStack_a43,
                                      CONCAT14(cStack_a44,
                                               CONCAT13(cStack_a45,
                                                        CONCAT12(cStack_a46,
                                                                 CONCAT11(cStack_a47,local_a48))))))
                   ) ^ local_a58;
  uVar71 = CONCAT17(cStack_a39,
                    CONCAT16(cStack_a3a,
                             CONCAT15(cStack_a3b,
                                      CONCAT14(cStack_a3c,
                                               CONCAT13(cStack_a3d,
                                                        CONCAT12(cStack_a3e,
                                                                 CONCAT11(cStack_a3f,cStack_a40)))))
                            )) ^ uStack_a50;
  local_cc8 = local_12e8;
  uStack_cc0 = uStack_12e0;
  local_cd8._0_1_ = (byte)uVar46;
  local_cd8._1_1_ = (byte)(uVar46 >> 8);
  local_cd8._2_1_ = (byte)(uVar46 >> 0x10);
  local_cd8._3_1_ = (byte)(uVar46 >> 0x18);
  local_cd8._4_1_ = (byte)(uVar46 >> 0x20);
  local_cd8._5_1_ = (byte)(uVar46 >> 0x28);
  local_cd8._6_1_ = (byte)(uVar46 >> 0x30);
  local_cd8._7_1_ = (byte)(uVar46 >> 0x38);
  uStack_cd0._0_1_ = (byte)uVar71;
  uStack_cd0._1_1_ = (byte)(uVar71 >> 8);
  uStack_cd0._2_1_ = (byte)(uVar71 >> 0x10);
  uStack_cd0._3_1_ = (byte)(uVar71 >> 0x18);
  uStack_cd0._4_1_ = (byte)(uVar71 >> 0x20);
  uStack_cd0._5_1_ = (byte)(uVar71 >> 0x28);
  uStack_cd0._6_1_ = (byte)(uVar71 >> 0x30);
  uStack_cd0._7_1_ = (byte)(uVar71 >> 0x38);
  local_1108._1_1_ =
       (local_ca8._1_1_ < local_cd8._1_1_) * local_cd8._1_1_ |
       (local_ca8._1_1_ >= local_cd8._1_1_) * local_ca8._1_1_;
  local_1108._0_1_ =
       ((byte)local_ca8 < (byte)local_cd8) * (byte)local_cd8 |
       ((byte)local_ca8 >= (byte)local_cd8) * (byte)local_ca8;
  local_1108._2_1_ =
       (local_ca8._2_1_ < local_cd8._2_1_) * local_cd8._2_1_ |
       (local_ca8._2_1_ >= local_cd8._2_1_) * local_ca8._2_1_;
  local_1108._3_1_ =
       (local_ca8._3_1_ < local_cd8._3_1_) * local_cd8._3_1_ |
       (local_ca8._3_1_ >= local_cd8._3_1_) * local_ca8._3_1_;
  local_1108._4_1_ =
       (local_ca8._4_1_ < local_cd8._4_1_) * local_cd8._4_1_ |
       (local_ca8._4_1_ >= local_cd8._4_1_) * local_ca8._4_1_;
  local_1108._5_1_ =
       (local_ca8._5_1_ < local_cd8._5_1_) * local_cd8._5_1_ |
       (local_ca8._5_1_ >= local_cd8._5_1_) * local_ca8._5_1_;
  local_1108._6_1_ =
       (local_ca8._6_1_ < local_cd8._6_1_) * local_cd8._6_1_ |
       (local_ca8._6_1_ >= local_cd8._6_1_) * local_ca8._6_1_;
  local_1108._7_1_ =
       (local_ca8._7_1_ < local_cd8._7_1_) * local_cd8._7_1_ |
       (local_ca8._7_1_ >= local_cd8._7_1_) * local_ca8._7_1_;
  uStack_1100._0_1_ =
       ((byte)uStack_ca0 < (byte)uStack_cd0) * (byte)uStack_cd0 |
       ((byte)uStack_ca0 >= (byte)uStack_cd0) * (byte)uStack_ca0;
  uStack_1100._1_1_ =
       (uStack_ca0._1_1_ < uStack_cd0._1_1_) * uStack_cd0._1_1_ |
       (uStack_ca0._1_1_ >= uStack_cd0._1_1_) * uStack_ca0._1_1_;
  uStack_1100._2_1_ =
       (uStack_ca0._2_1_ < uStack_cd0._2_1_) * uStack_cd0._2_1_ |
       (uStack_ca0._2_1_ >= uStack_cd0._2_1_) * uStack_ca0._2_1_;
  uStack_1100._3_1_ =
       (uStack_ca0._3_1_ < uStack_cd0._3_1_) * uStack_cd0._3_1_ |
       (uStack_ca0._3_1_ >= uStack_cd0._3_1_) * uStack_ca0._3_1_;
  uStack_1100._4_1_ =
       (uStack_ca0._4_1_ < uStack_cd0._4_1_) * uStack_cd0._4_1_ |
       (uStack_ca0._4_1_ >= uStack_cd0._4_1_) * uStack_ca0._4_1_;
  uStack_1100._5_1_ =
       (uStack_ca0._5_1_ < uStack_cd0._5_1_) * uStack_cd0._5_1_ |
       (uStack_ca0._5_1_ >= uStack_cd0._5_1_) * uStack_ca0._5_1_;
  uStack_1100._6_1_ =
       (uStack_ca0._6_1_ < uStack_cd0._6_1_) * uStack_cd0._6_1_ |
       (uStack_ca0._6_1_ >= uStack_cd0._6_1_) * uStack_ca0._6_1_;
  uStack_1100._7_1_ =
       (uStack_ca0._7_1_ < uStack_cd0._7_1_) * uStack_cd0._7_1_ |
       (uStack_ca0._7_1_ >= uStack_cd0._7_1_) * uStack_ca0._7_1_;
  b[1] = alVar90[1];
  a_01[1] = in_RSI;
  a_01[0] = (longlong)in_RDI;
  local_f38 = local_f48;
  uStack_f30 = uStack_f40;
  local_de8 = uVar1;
  uStack_de0 = uVar2;
  local_dd8 = uVar3;
  uStack_dd0 = uVar4;
  local_dc8 = uVar72;
  uStack_dc0 = uVar5;
  local_cd8 = uVar46;
  uStack_cd0 = uVar71;
  local_cb8 = uVar6;
  uStack_cb0 = uVar34;
  local_ca8 = uVar35;
  uStack_ca0 = uVar36;
  local_b88 = uVar45;
  local_1118 = local_f48;
  uStack_1110 = local_f48;
  alVar89 = abs_diff(a_01,b);
  b_00[0] = alVar89[1];
  b_00[1] = alVar90[1];
  a_02[1] = in_RSI;
  a_02[0] = (longlong)in_RDI;
  abs_diff(a_02,b_00);
  puVar38 = local_10c0;
  local_ce8 = (byte)extraout_XMM0_Qa_01;
  bStack_ce7 = (byte)((ulong)extraout_XMM0_Qa_01 >> 8);
  bStack_ce6 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  bStack_ce5 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x18);
  bStack_ce4 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  bStack_ce3 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x28);
  bStack_ce2 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  bStack_ce1 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x38);
  bStack_ce0 = (byte)extraout_XMM0_Qb_01;
  bStack_cdf = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_cde = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_cdd = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_cdc = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_cdb = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_cda = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_cd9 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_cf8 = (byte)extraout_XMM0_Qa_02;
  bStack_cf7 = (byte)((ulong)extraout_XMM0_Qa_02 >> 8);
  bStack_cf6 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  bStack_cf5 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x18);
  bStack_cf4 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  bStack_cf3 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x28);
  bStack_cf2 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  bStack_cf1 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x38);
  bStack_cf0 = (byte)extraout_XMM0_Qb_02;
  bStack_cef = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_cee = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_ced = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_cec = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_ceb = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_cea = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_ce9 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  local_12f8 = (local_ce8 < local_cf8) * local_cf8 | (local_ce8 >= local_cf8) * local_ce8;
  bStack_12f7 = (bStack_ce7 < bStack_cf7) * bStack_cf7 | (bStack_ce7 >= bStack_cf7) * bStack_ce7;
  bStack_12f6 = (bStack_ce6 < bStack_cf6) * bStack_cf6 | (bStack_ce6 >= bStack_cf6) * bStack_ce6;
  bStack_12f5 = (bStack_ce5 < bStack_cf5) * bStack_cf5 | (bStack_ce5 >= bStack_cf5) * bStack_ce5;
  bStack_12f4 = (bStack_ce4 < bStack_cf4) * bStack_cf4 | (bStack_ce4 >= bStack_cf4) * bStack_ce4;
  bStack_12f3 = (bStack_ce3 < bStack_cf3) * bStack_cf3 | (bStack_ce3 >= bStack_cf3) * bStack_ce3;
  bStack_12f2 = (bStack_ce2 < bStack_cf2) * bStack_cf2 | (bStack_ce2 >= bStack_cf2) * bStack_ce2;
  bStack_12f1 = (bStack_ce1 < bStack_cf1) * bStack_cf1 | (bStack_ce1 >= bStack_cf1) * bStack_ce1;
  bStack_12f0 = (bStack_ce0 < bStack_cf0) * bStack_cf0 | (bStack_ce0 >= bStack_cf0) * bStack_ce0;
  bStack_12ef = (bStack_cdf < bStack_cef) * bStack_cef | (bStack_cdf >= bStack_cef) * bStack_cdf;
  bStack_12ee = (bStack_cde < bStack_cee) * bStack_cee | (bStack_cde >= bStack_cee) * bStack_cde;
  bStack_12ed = (bStack_cdd < bStack_ced) * bStack_ced | (bStack_cdd >= bStack_ced) * bStack_cdd;
  bStack_12ec = (bStack_cdc < bStack_cec) * bStack_cec | (bStack_cdc >= bStack_cec) * bStack_cdc;
  bStack_12eb = (bStack_cdb < bStack_ceb) * bStack_ceb | (bStack_cdb >= bStack_ceb) * bStack_cdb;
  bStack_12ea = (bStack_cda < bStack_cea) * bStack_cea | (bStack_cda >= bStack_cea) * bStack_cda;
  bStack_12e9 = (bStack_cd9 < bStack_ce9) * bStack_ce9 | (bStack_cd9 >= bStack_ce9) * bStack_cd9;
  local_d08 = CONCAT17(bStack_12f1,
                       CONCAT16(bStack_12f2,
                                CONCAT15(bStack_12f3,
                                         CONCAT14(bStack_12f4,
                                                  CONCAT13(bStack_12f5,
                                                           CONCAT12(bStack_12f6,
                                                                    CONCAT11(bStack_12f7,local_12f8)
                                                                   ))))));
  uStack_d00 = CONCAT17(bStack_12e9,
                        CONCAT16(bStack_12ea,
                                 CONCAT15(bStack_12eb,
                                          CONCAT14(bStack_12ec,
                                                   CONCAT13(bStack_12ed,
                                                            CONCAT12(bStack_12ee,
                                                                     CONCAT11(bStack_12ef,
                                                                              bStack_12f0)))))));
  local_d18 = local_1108;
  uVar5 = local_d18;
  uStack_d10 = uStack_1100;
  uVar6 = uStack_d10;
  local_d18._0_1_ = (byte)local_1108;
  local_d18._1_1_ = local_1108._1_1_;
  local_d18._2_1_ = local_1108._2_1_;
  local_d18._3_1_ = local_1108._3_1_;
  local_d18._4_1_ = local_1108._4_1_;
  local_d18._5_1_ = local_1108._5_1_;
  local_d18._6_1_ = local_1108._6_1_;
  local_d18._7_1_ = local_1108._7_1_;
  uStack_d10._0_1_ = local_1108._8_1_;
  uStack_d10._1_1_ = local_1108._9_1_;
  uStack_d10._2_1_ = local_1108._10_1_;
  uStack_d10._3_1_ = local_1108._11_1_;
  uStack_d10._4_1_ = local_1108._12_1_;
  uStack_d10._5_1_ = local_1108._13_1_;
  uStack_d10._6_1_ = local_1108._14_1_;
  uStack_d10._7_1_ = local_1108._15_1_;
  bVar39 = (local_12f8 < (byte)local_d18) * (byte)local_d18 |
           (local_12f8 >= (byte)local_d18) * local_12f8;
  bVar49 = (bStack_12f7 < local_d18._1_1_) * local_d18._1_1_ |
           (bStack_12f7 >= local_d18._1_1_) * bStack_12f7;
  bVar50 = (bStack_12f6 < local_d18._2_1_) * local_d18._2_1_ |
           (bStack_12f6 >= local_d18._2_1_) * bStack_12f6;
  bVar54 = (bStack_12f5 < local_d18._3_1_) * local_d18._3_1_ |
           (bStack_12f5 >= local_d18._3_1_) * bStack_12f5;
  bVar55 = (bStack_12f4 < local_d18._4_1_) * local_d18._4_1_ |
           (bStack_12f4 >= local_d18._4_1_) * bStack_12f4;
  bVar59 = (bStack_12f3 < local_d18._5_1_) * local_d18._5_1_ |
           (bStack_12f3 >= local_d18._5_1_) * bStack_12f3;
  bVar60 = (bStack_12f2 < local_d18._6_1_) * local_d18._6_1_ |
           (bStack_12f2 >= local_d18._6_1_) * bStack_12f2;
  bVar64 = (bStack_12f1 < local_d18._7_1_) * local_d18._7_1_ |
           (bStack_12f1 >= local_d18._7_1_) * bStack_12f1;
  bVar65 = (bStack_12f0 < (byte)uStack_d10) * (byte)uStack_d10 |
           (bStack_12f0 >= (byte)uStack_d10) * bStack_12f0;
  bVar73 = (bStack_12ef < uStack_d10._1_1_) * uStack_d10._1_1_ |
           (bStack_12ef >= uStack_d10._1_1_) * bStack_12ef;
  bVar74 = (bStack_12ee < uStack_d10._2_1_) * uStack_d10._2_1_ |
           (bStack_12ee >= uStack_d10._2_1_) * bStack_12ee;
  bVar78 = (bStack_12ed < uStack_d10._3_1_) * uStack_d10._3_1_ |
           (bStack_12ed >= uStack_d10._3_1_) * bStack_12ed;
  bVar79 = (bStack_12ec < uStack_d10._4_1_) * uStack_d10._4_1_ |
           (bStack_12ec >= uStack_d10._4_1_) * bStack_12ec;
  bVar83 = (bStack_12eb < uStack_d10._5_1_) * uStack_d10._5_1_ |
           (bStack_12eb >= uStack_d10._5_1_) * bStack_12eb;
  bVar84 = (bStack_12ea < uStack_d10._6_1_) * uStack_d10._6_1_ |
           (bStack_12ea >= uStack_d10._6_1_) * bStack_12ea;
  bVar88 = (bStack_12e9 < uStack_d10._7_1_) * uStack_d10._7_1_ |
           (bStack_12e9 >= uStack_d10._7_1_) * bStack_12e9;
  local_1108._0_2_ = CONCAT11(bVar49,bVar39);
  local_1108._0_3_ = CONCAT12(bVar50,(undefined2)local_1108);
  local_1108._0_4_ = CONCAT13(bVar54,(undefined3)local_1108);
  local_1108._0_5_ = CONCAT14(bVar55,(undefined4)local_1108);
  local_1108._0_6_ = CONCAT15(bVar59,(undefined5)local_1108);
  local_1108._0_7_ = CONCAT16(bVar60,(undefined6)local_1108);
  local_1108 = CONCAT17(bVar64,(undefined7)local_1108);
  uStack_1100._0_1_ = bVar65;
  uStack_1100._1_1_ = bVar73;
  uStack_1100._2_1_ = bVar74;
  uStack_1100._3_1_ = bVar78;
  uStack_1100._4_1_ = bVar79;
  uStack_1100._5_1_ = bVar83;
  uStack_1100._6_1_ = bVar84;
  uStack_1100._7_1_ = bVar88;
  local_d28 = local_1108;
  uStack_d20 = uStack_1100;
  local_d38 = uStack_1100;
  uStack_d30 = 0;
  local_1108._0_2_ =
       CONCAT11((bVar49 < bVar73) * bVar73 | (bVar49 >= bVar73) * bVar49,
                (bVar39 < bVar65) * bVar65 | (bVar39 >= bVar65) * bVar39);
  local_1108._0_3_ =
       CONCAT12((bVar50 < bVar74) * bVar74 | (bVar50 >= bVar74) * bVar50,(undefined2)local_1108);
  local_1108._0_4_ =
       CONCAT13((bVar54 < bVar78) * bVar78 | (bVar54 >= bVar78) * bVar54,(undefined3)local_1108);
  local_1108._0_5_ =
       CONCAT14((bVar55 < bVar79) * bVar79 | (bVar55 >= bVar79) * bVar55,(undefined4)local_1108);
  local_1108._0_6_ =
       CONCAT15((bVar59 < bVar83) * bVar83 | (bVar59 >= bVar83) * bVar59,(undefined5)local_1108);
  local_1108._0_7_ =
       CONCAT16((bVar60 < bVar84) * bVar84 | (bVar60 >= bVar84) * bVar60,(undefined6)local_1108);
  local_1108 = CONCAT17((bVar64 < bVar88) * bVar88 | (bVar64 >= bVar88) * bVar64,
                        (undefined7)local_1108);
  local_ab8 = *(undefined8 *)*local_10d8;
  uStack_ab0 = *(undefined8 *)(*local_10d8 + 8);
  local_aa8 = local_1108;
  uStack_aa0 = uStack_1100;
  auVar18._8_8_ = uStack_1100;
  auVar18._0_8_ = local_1108;
  auVar47 = psubusb(auVar18,*local_10d8);
  local_1108 = auVar47._0_8_;
  uStack_1100 = auVar47._8_8_;
  local_e08 = local_1108;
  uVar3 = local_e08;
  uStack_e00 = uStack_1100;
  uVar4 = uStack_e00;
  local_e18 = local_10f8;
  uVar1 = local_e18;
  uStack_e10 = uStack_10f0;
  uVar2 = uStack_e10;
  local_e08._0_1_ = auVar47[0];
  local_e08._1_1_ = auVar47[1];
  local_e08._2_1_ = auVar47[2];
  local_e08._3_1_ = auVar47[3];
  local_e08._4_1_ = auVar47[4];
  local_e08._5_1_ = auVar47[5];
  local_e08._6_1_ = auVar47[6];
  local_e08._7_1_ = auVar47[7];
  uStack_e00._0_1_ = auVar47[8];
  uStack_e00._1_1_ = auVar47[9];
  uStack_e00._2_1_ = auVar47[10];
  uStack_e00._3_1_ = auVar47[0xb];
  uStack_e00._4_1_ = auVar47[0xc];
  uStack_e00._5_1_ = auVar47[0xd];
  uStack_e00._6_1_ = auVar47[0xe];
  uStack_e00._7_1_ = auVar47[0xf];
  local_e18._0_1_ = (char)local_10f8;
  local_e18._1_1_ = (char)((ulong)local_10f8 >> 8);
  local_e18._2_1_ = (char)((ulong)local_10f8 >> 0x10);
  local_e18._3_1_ = (char)((ulong)local_10f8 >> 0x18);
  local_e18._4_1_ = (char)((ulong)local_10f8 >> 0x20);
  local_e18._5_1_ = (char)((ulong)local_10f8 >> 0x28);
  local_e18._6_1_ = (char)((ulong)local_10f8 >> 0x30);
  local_e18._7_1_ = (char)((ulong)local_10f8 >> 0x38);
  uStack_e10._0_1_ = (char)uStack_10f0;
  uStack_e10._1_1_ = (char)((ulong)uStack_10f0 >> 8);
  uStack_e10._2_1_ = (char)((ulong)uStack_10f0 >> 0x10);
  uStack_e10._3_1_ = (char)((ulong)uStack_10f0 >> 0x18);
  uStack_e10._4_1_ = (char)((ulong)uStack_10f0 >> 0x20);
  uStack_e10._5_1_ = (char)((ulong)uStack_10f0 >> 0x28);
  uStack_e10._6_1_ = (char)((ulong)uStack_10f0 >> 0x30);
  uStack_e10._7_1_ = (char)((ulong)uStack_10f0 >> 0x38);
  local_1108._0_2_ =
       CONCAT11(-(local_e08._1_1_ == local_e18._1_1_),-((char)local_e08 == (char)local_e18));
  local_1108._0_3_ = CONCAT12(-(local_e08._2_1_ == local_e18._2_1_),(undefined2)local_1108);
  local_1108._0_4_ = CONCAT13(-(local_e08._3_1_ == local_e18._3_1_),(undefined3)local_1108);
  local_1108._0_5_ = CONCAT14(-(local_e08._4_1_ == local_e18._4_1_),(undefined4)local_1108);
  local_1108._0_6_ = CONCAT15(-(local_e08._5_1_ == local_e18._5_1_),(undefined5)local_1108);
  local_1108._0_7_ = CONCAT16(-(local_e08._6_1_ == local_e18._6_1_),(undefined6)local_1108);
  local_1108 = CONCAT17(-(local_e08._7_1_ == local_e18._7_1_),(undefined7)local_1108);
  uStack_1100._0_1_ = -((char)uStack_e00 == (char)uStack_e10);
  uStack_1100._1_1_ = -(uStack_e00._1_1_ == uStack_e10._1_1_);
  uStack_1100._2_1_ = -(uStack_e00._2_1_ == uStack_e10._2_1_);
  uStack_1100._3_1_ = -(uStack_e00._3_1_ == uStack_e10._3_1_);
  uStack_1100._4_1_ = -(uStack_e00._4_1_ == uStack_e10._4_1_);
  uStack_1100._5_1_ = -(uStack_e00._5_1_ == uStack_e10._5_1_);
  uStack_1100._6_1_ = -(uStack_e00._6_1_ == uStack_e10._6_1_);
  uStack_1100._7_1_ = -(uStack_e00._7_1_ == uStack_e10._7_1_);
  local_3e0 = &local_1228;
  local_3e8 = &local_1218;
  local_3f0 = &local_1118;
  local_400 = local_10c0;
  local_408 = local_10c8;
  local_9d = 3;
  local_9e = 3;
  local_9f = 3;
  local_a0 = 3;
  local_a1 = 3;
  local_a2 = 3;
  local_a3 = 3;
  local_a4 = 3;
  local_a5 = 4;
  local_a6 = 4;
  local_a7 = 4;
  local_a8 = 4;
  local_a9 = 4;
  local_aa = 4;
  local_ab = 4;
  local_ac = 4;
  local_418 = 0x404040404040404;
  uStack_410 = 0x303030303030303;
  local_349 = 0x80;
  local_c9 = 0x80;
  local_ca = 0x80;
  local_cb = 0x80;
  local_cc = 0x80;
  local_cd = 0x80;
  local_ce = 0x80;
  local_cf = 0x80;
  local_d0 = 0x80;
  local_d1 = 0x80;
  local_d2 = 0x80;
  local_d3 = 0x80;
  local_d4 = 0x80;
  local_d5 = 0x80;
  local_d6 = 0x80;
  local_d7 = 0x80;
  local_d8 = 0x80;
  local_428 = 0x8080808080808080;
  uStack_420 = 0x8080808080808080;
  local_498 = 0xff;
  uStack_497 = 0xff;
  uStack_496 = 0xff;
  uStack_495 = 0xff;
  uStack_494 = 0xff;
  uStack_493 = 0xff;
  uStack_492 = 0xff;
  uStack_491 = 0xff;
  uStack_490 = 0xff;
  uStack_48f = 0xff;
  uStack_48e = 0xff;
  uStack_48d = 0xff;
  uStack_48c = 0xff;
  uStack_48b = 0xff;
  uStack_48a = 0xff;
  uStack_489 = 0xff;
  local_278 = local_1228;
  uStack_270 = uStack_1220;
  local_1b8 = local_1228 ^ 0x8080808080808080;
  uStack_1b0 = uStack_1220 ^ 0x8080808080808080;
  uStack_290 = uStack_1210;
  local_1c8 = local_1218 ^ 0x8080808080808080;
  uStack_250 = uStack_1210 ^ 0x8080808080808080;
  auVar26._8_8_ = uStack_1b0;
  auVar26._0_8_ = local_1b8;
  auVar25._8_8_ = uStack_250;
  auVar25._0_8_ = local_1c8;
  local_458 = psubsb(auVar26,auVar25);
  local_308 = local_1118;
  uStack_300 = uStack_1110;
  local_2f8 = local_458._8_8_;
  uStack_2f0 = 0;
  local_1d8 = local_458._8_8_ & local_1118;
  uStack_1d0 = 0;
  local_1e8 = local_458._0_8_;
  uStack_1e0 = local_458._8_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_1d8;
  auVar47 = psubsb(auVar24,local_458);
  local_438 = auVar47._0_8_;
  uStack_430 = auVar47._8_8_;
  local_1f8 = local_438;
  uStack_1f0 = uStack_430;
  local_208 = local_458._0_8_;
  uStack_200 = local_458._8_8_;
  auVar47 = psubsb(auVar47,local_458);
  local_438 = auVar47._0_8_;
  uStack_430 = auVar47._8_8_;
  local_218 = local_438;
  uStack_210 = uStack_430;
  local_228 = local_458._0_8_;
  uStack_220 = local_458._8_8_;
  auVar47 = psubsb(auVar47,local_458);
  local_438 = auVar47._0_8_;
  uStack_430 = auVar47._8_8_;
  local_328 = local_1108;
  uStack_320 = uStack_1100;
  local_318 = local_438;
  uStack_310 = uStack_430;
  local_378 = local_438 & local_1108;
  uStack_370 = uStack_430 & uStack_1100;
  auVar30._8_8_ = local_378;
  auVar30._0_8_ = local_378;
  auVar29._8_8_ = 0x303030303030303;
  auVar29._0_8_ = 0x404040404040404;
  auVar47 = paddsb(auVar30,auVar29);
  local_448 = auVar47._0_8_;
  uStack_440 = auVar47._8_8_;
  local_138 = local_448;
  uStack_130 = uStack_440;
  uVar36 = uStack_130;
  local_148 = local_448;
  uStack_140 = uStack_440;
  uStack_130._0_1_ = auVar47[8];
  uStack_130._1_1_ = auVar47[9];
  uStack_130._2_1_ = auVar47[10];
  uStack_130._3_1_ = auVar47[0xb];
  uStack_130._4_1_ = auVar47[0xc];
  uStack_130._5_1_ = auVar47[0xd];
  uStack_130._6_1_ = auVar47[0xe];
  uStack_130._7_1_ = auVar47[0xf];
  local_438._0_2_ = CONCAT11((undefined1)uStack_130,(undefined1)uStack_130);
  local_438._0_3_ = CONCAT12(uStack_130._1_1_,(undefined2)local_438);
  local_438._0_4_ = CONCAT13(uStack_130._1_1_,(undefined3)local_438);
  local_438._0_5_ = CONCAT14(uStack_130._2_1_,(undefined4)local_438);
  local_438._0_6_ = CONCAT15(uStack_130._2_1_,(undefined5)local_438);
  local_438._0_7_ = CONCAT16(uStack_130._3_1_,(undefined6)local_438);
  local_438 = CONCAT17(uStack_130._3_1_,(undefined7)local_438);
  uStack_430._0_1_ = uStack_130._4_1_;
  uStack_430._1_1_ = uStack_130._4_1_;
  uStack_430._2_1_ = uStack_130._5_1_;
  uStack_430._3_1_ = uStack_130._5_1_;
  uStack_430._4_1_ = uStack_130._6_1_;
  uStack_430._5_1_ = uStack_130._6_1_;
  uStack_430._6_1_ = uStack_130._7_1_;
  uStack_430._7_1_ = uStack_130._7_1_;
  local_3a8 = local_448;
  uVar35 = local_3a8;
  uStack_3a0 = uStack_440;
  local_3b8 = local_448;
  uStack_3b0 = uStack_440;
  local_3a8._0_1_ = auVar47[0];
  local_3a8._1_1_ = auVar47[1];
  local_3a8._2_1_ = auVar47[2];
  local_3a8._3_1_ = auVar47[3];
  local_3a8._4_1_ = auVar47[4];
  local_3a8._5_1_ = auVar47[5];
  local_3a8._6_1_ = auVar47[6];
  local_3a8._7_1_ = auVar47[7];
  local_448._0_2_ = CONCAT11((undefined1)local_3a8,(undefined1)local_3a8);
  local_448._0_3_ = CONCAT12(local_3a8._1_1_,(undefined2)local_448);
  local_448._0_4_ = CONCAT13(local_3a8._1_1_,(undefined3)local_448);
  local_448._0_5_ = CONCAT14(local_3a8._2_1_,(undefined4)local_448);
  local_448._0_6_ = CONCAT15(local_3a8._2_1_,(undefined5)local_448);
  local_448._0_7_ = CONCAT16(local_3a8._3_1_,(undefined6)local_448);
  local_448 = CONCAT17(local_3a8._3_1_,(undefined7)local_448);
  uStack_440._0_1_ = local_3a8._4_1_;
  uStack_440._1_1_ = local_3a8._4_1_;
  uStack_440._2_1_ = local_3a8._5_1_;
  uStack_440._3_1_ = local_3a8._5_1_;
  uStack_440._4_1_ = local_3a8._6_1_;
  uStack_440._5_1_ = local_3a8._6_1_;
  uStack_440._6_1_ = local_3a8._7_1_;
  uStack_440._7_1_ = local_3a8._7_1_;
  local_58 = local_448;
  uStack_50 = uStack_440;
  local_5c = 0xb;
  auVar33._8_8_ = uStack_440;
  auVar33._0_8_ = local_448;
  auVar47 = psraw(auVar33,ZEXT416(0xb));
  local_78 = local_438;
  uStack_70 = uStack_430;
  local_7c = 0xb;
  auVar32._8_8_ = uStack_430;
  auVar32._0_8_ = local_438;
  auVar48 = psraw(auVar32,ZEXT416(0xb));
  local_448 = auVar47._0_8_;
  uStack_440 = auVar47._8_8_;
  local_438 = auVar48._0_8_;
  uStack_430 = auVar48._8_8_;
  local_f8 = local_448;
  uStack_f0 = uStack_440;
  local_108 = local_438;
  uStack_100 = uStack_430;
  auVar48 = packsswb(auVar47,auVar48);
  local_448 = auVar48._0_8_;
  uStack_440 = auVar48._8_8_;
  uStack_380 = uStack_440;
  local_248 = 0xffffffffffffffff;
  uStack_240 = 0xffffffffffffffff;
  local_238 = local_448;
  uStack_230 = uStack_440;
  auVar23._8_8_ = 0xffffffffffffffff;
  auVar23._0_8_ = 0xffffffffffffffff;
  auVar47 = psubsb(auVar48,auVar23);
  local_438 = auVar47._0_8_;
  uStack_430 = auVar47._8_8_;
  local_3c8 = local_438;
  uVar34 = local_3c8;
  uStack_3c0 = uStack_430;
  local_3d8 = local_438;
  uStack_3d0 = uStack_430;
  local_3c8._0_1_ = auVar47[0];
  local_3c8._1_1_ = auVar47[1];
  local_3c8._2_1_ = auVar47[2];
  local_3c8._3_1_ = auVar47[3];
  local_3c8._4_1_ = auVar47[4];
  local_3c8._5_1_ = auVar47[5];
  local_3c8._6_1_ = auVar47[6];
  local_3c8._7_1_ = auVar47[7];
  local_438._0_2_ = CONCAT11((undefined1)local_3c8,(undefined1)local_3c8);
  local_438._0_3_ = CONCAT12(local_3c8._1_1_,(undefined2)local_438);
  local_438._0_4_ = CONCAT13(local_3c8._1_1_,(undefined3)local_438);
  local_438._0_5_ = CONCAT14(local_3c8._2_1_,(undefined4)local_438);
  local_438._0_6_ = CONCAT15(local_3c8._2_1_,(undefined5)local_438);
  local_438._0_7_ = CONCAT16(local_3c8._3_1_,(undefined6)local_438);
  local_438 = CONCAT17(local_3c8._3_1_,(undefined7)local_438);
  uStack_430._0_1_ = local_3c8._4_1_;
  uStack_430._1_1_ = local_3c8._4_1_;
  uStack_430._2_1_ = local_3c8._5_1_;
  uStack_430._3_1_ = local_3c8._5_1_;
  uStack_430._4_1_ = local_3c8._6_1_;
  uStack_430._5_1_ = local_3c8._6_1_;
  uStack_430._6_1_ = local_3c8._7_1_;
  uStack_430._7_1_ = local_3c8._7_1_;
  local_98 = local_438;
  uStack_90 = uStack_430;
  local_9c = 9;
  auVar31._8_8_ = uStack_430;
  auVar31._0_8_ = local_438;
  auVar47 = psraw(auVar31,ZEXT416(9));
  local_438 = auVar47._0_8_;
  uStack_430 = auVar47._8_8_;
  local_118 = local_438;
  uStack_110 = uStack_430;
  local_128 = local_438;
  uStack_120 = uStack_430;
  auVar47 = packsswb(auVar47,auVar47);
  local_158 = local_1118;
  uStack_150 = uStack_1110;
  local_438 = auVar47._0_8_;
  uStack_430 = auVar47._8_8_;
  local_168 = local_438;
  uStack_160 = uStack_430;
  local_398 = ~local_1118 & local_438;
  uStack_390 = ~uStack_1110 & uStack_430;
  uStack_430 = uStack_390;
  local_438 = local_398;
  auVar47 = _local_438;
  uStack_440._4_4_ = auVar48._12_4_;
  uVar7 = uStack_440._4_4_;
  local_438._0_4_ = (undefined4)local_398;
  uStack_430._4_4_ = (undefined4)(uStack_390 >> 0x20);
  uStack_2c = uStack_440._4_4_;
  _local_28 = CONCAT44(uStack_24,(undefined4)local_438);
  uStack_3c = uStack_430._4_4_;
  _local_38 = CONCAT44(auVar48._4_4_,0x80808080);
  uStack_480 = uStack_30;
  uStack_47c = uStack_440._4_4_;
  local_478._4_4_ = uStack_430._4_4_;
  local_478._0_4_ = uStack_40;
  local_388 = local_448;
  uStack_440 = local_398;
  local_258 = local_478._0_8_;
  local_268 = local_448;
  auVar22._8_8_ = uStack_250;
  auVar22._0_8_ = local_478._0_8_;
  auVar21._8_8_ = local_398;
  auVar21._0_8_ = local_448;
  local_478 = psubsb(auVar22,auVar21);
  uStack_1a0 = CONCAT44(uVar7,uStack_30);
  local_1a8 = local_488;
  auVar28._8_8_ = uStack_1b0;
  auVar28._0_8_ = local_1b8;
  auVar27._8_8_ = uStack_1a0;
  auVar27._0_8_ = local_488;
  local_468 = paddsb(auVar28,auVar27);
  local_2b8 = local_478._0_8_;
  uStack_2b0 = local_478._8_8_;
  uVar72 = local_478._8_8_ ^ 0x8080808080808080;
  local_e18 = uVar1;
  uStack_e10 = uVar2;
  local_e08 = uVar3;
  uStack_e00 = uVar4;
  local_d18 = uVar5;
  uStack_d10 = uVar6;
  _local_438 = auVar47;
  local_3f8 = &local_1108;
  local_3c8 = uVar34;
  local_3a8 = uVar35;
  local_368 = local_378;
  uStack_360 = uStack_370;
  local_348 = local_428;
  uStack_340 = uStack_420;
  local_338 = local_428;
  uStack_330 = uStack_420;
  local_2c8 = local_428;
  uStack_2c0 = uStack_420;
  local_2a8 = local_428;
  uStack_2a0 = uStack_420;
  local_288 = local_428;
  uStack_280 = uStack_420;
  uStack_260 = local_398;
  uStack_1c0 = uStack_250;
  local_198 = local_1b8;
  uStack_190 = uStack_1b0;
  local_188 = local_418;
  uStack_180 = uStack_410;
  local_178 = local_378;
  uStack_170 = local_378;
  uStack_130 = uVar36;
  local_e8 = local_428;
  uStack_e0 = uStack_420;
  local_c8 = local_418;
  uStack_c0 = uStack_410;
  local_48 = local_398;
  *local_10c0 = local_478._0_8_ ^ 0x8080808080808080;
  puVar38[1] = uVar72;
  puVar37 = local_408;
  local_2d8 = local_468._0_8_;
  uStack_2d0 = local_468._8_8_;
  local_2e8 = local_428;
  uStack_2e0 = uStack_420;
  uVar72 = local_468._8_8_ ^ uStack_420;
  *local_408 = local_468._0_8_ ^ local_428;
  puVar37[1] = uVar72;
  b_01[1] = (longlong)puVar38;
  b_01[0] = (longlong)&local_1108;
  a_03[1] = in_RSI;
  a_03[0] = (longlong)in_RDI;
  alVar90 = abs_diff(a_03,b_01);
  b_02[0] = alVar90[1];
  b_02[1] = (longlong)puVar38;
  a_04[1] = in_RSI;
  a_04[0] = (longlong)in_RDI;
  abs_diff(a_04,b_02);
  puVar38 = local_1090;
  local_d48 = (byte)extraout_XMM0_Qa_03;
  bStack_d47 = (byte)((ulong)extraout_XMM0_Qa_03 >> 8);
  bStack_d46 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
  bStack_d45 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x18);
  bStack_d44 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  bStack_d43 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x28);
  bStack_d42 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
  bStack_d41 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x38);
  bStack_d40 = (byte)extraout_XMM0_Qb_03;
  bStack_d3f = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_d3e = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_d3d = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_d3c = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_d3b = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_d3a = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_d39 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_d58 = (byte)extraout_XMM0_Qa_04;
  bStack_d57 = (byte)((ulong)extraout_XMM0_Qa_04 >> 8);
  bStack_d56 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x10);
  bStack_d55 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x18);
  bStack_d54 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  bStack_d53 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x28);
  bStack_d52 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x30);
  bStack_d51 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x38);
  bStack_d50 = (byte)extraout_XMM0_Qb_04;
  bStack_d4f = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_d4e = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_d4d = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_d4c = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_d4b = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_d4a = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_d49 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  bVar39 = (local_d48 < local_d58) * local_d58 | (local_d48 >= local_d58) * local_d48;
  bVar49 = (bStack_d47 < bStack_d57) * bStack_d57 | (bStack_d47 >= bStack_d57) * bStack_d47;
  bVar50 = (bStack_d46 < bStack_d56) * bStack_d56 | (bStack_d46 >= bStack_d56) * bStack_d46;
  bVar54 = (bStack_d45 < bStack_d55) * bStack_d55 | (bStack_d45 >= bStack_d55) * bStack_d45;
  bVar55 = (bStack_d44 < bStack_d54) * bStack_d54 | (bStack_d44 >= bStack_d54) * bStack_d44;
  bVar59 = (bStack_d43 < bStack_d53) * bStack_d53 | (bStack_d43 >= bStack_d53) * bStack_d43;
  bVar60 = (bStack_d42 < bStack_d52) * bStack_d52 | (bStack_d42 >= bStack_d52) * bStack_d42;
  bVar64 = (bStack_d41 < bStack_d51) * bStack_d51 | (bStack_d41 >= bStack_d51) * bStack_d41;
  bVar65 = (bStack_d40 < bStack_d50) * bStack_d50 | (bStack_d40 >= bStack_d50) * bStack_d40;
  bVar73 = (bStack_d3f < bStack_d4f) * bStack_d4f | (bStack_d3f >= bStack_d4f) * bStack_d3f;
  bVar74 = (bStack_d3e < bStack_d4e) * bStack_d4e | (bStack_d3e >= bStack_d4e) * bStack_d3e;
  bVar78 = (bStack_d3d < bStack_d4d) * bStack_d4d | (bStack_d3d >= bStack_d4d) * bStack_d3d;
  bVar79 = (bStack_d3c < bStack_d4c) * bStack_d4c | (bStack_d3c >= bStack_d4c) * bStack_d3c;
  bVar83 = (bStack_d3b < bStack_d4b) * bStack_d4b | (bStack_d3b >= bStack_d4b) * bStack_d3b;
  bVar84 = (bStack_d3a < bStack_d4a) * bStack_d4a | (bStack_d3a >= bStack_d4a) * bStack_d3a;
  bVar88 = (bStack_d39 < bStack_d49) * bStack_d49 | (bStack_d39 >= bStack_d49) * bStack_d39;
  local_d68 = (byte)local_12e8;
  bStack_d67 = (byte)((ulong)local_12e8 >> 8);
  bStack_d66 = (byte)((ulong)local_12e8 >> 0x10);
  bStack_d65 = (byte)((ulong)local_12e8 >> 0x18);
  bStack_d64 = (byte)((ulong)local_12e8 >> 0x20);
  bStack_d63 = (byte)((ulong)local_12e8 >> 0x28);
  bStack_d62 = (byte)((ulong)local_12e8 >> 0x30);
  bStack_d61 = (byte)((ulong)local_12e8 >> 0x38);
  bStack_d60 = (byte)uStack_12e0;
  bStack_d5f = (byte)((ulong)uStack_12e0 >> 8);
  bStack_d5e = (byte)((ulong)uStack_12e0 >> 0x10);
  bStack_d5d = (byte)((ulong)uStack_12e0 >> 0x18);
  bStack_d5c = (byte)((ulong)uStack_12e0 >> 0x20);
  bStack_d5b = (byte)((ulong)uStack_12e0 >> 0x28);
  bStack_d5a = (byte)((ulong)uStack_12e0 >> 0x30);
  bStack_d59 = (byte)((ulong)uStack_12e0 >> 0x38);
  bVar39 = (local_d68 < bVar39) * bVar39 | (local_d68 >= bVar39) * local_d68;
  bVar49 = (bStack_d67 < bVar49) * bVar49 | (bStack_d67 >= bVar49) * bStack_d67;
  bVar50 = (bStack_d66 < bVar50) * bVar50 | (bStack_d66 >= bVar50) * bStack_d66;
  bVar54 = (bStack_d65 < bVar54) * bVar54 | (bStack_d65 >= bVar54) * bStack_d65;
  bVar55 = (bStack_d64 < bVar55) * bVar55 | (bStack_d64 >= bVar55) * bStack_d64;
  bVar59 = (bStack_d63 < bVar59) * bVar59 | (bStack_d63 >= bVar59) * bStack_d63;
  bVar60 = (bStack_d62 < bVar60) * bVar60 | (bStack_d62 >= bVar60) * bStack_d62;
  bVar64 = (bStack_d61 < bVar64) * bVar64 | (bStack_d61 >= bVar64) * bStack_d61;
  uStack_1120._0_1_ = (bStack_d60 < bVar65) * bVar65 | (bStack_d60 >= bVar65) * bStack_d60;
  uStack_1120._1_1_ = (bStack_d5f < bVar73) * bVar73 | (bStack_d5f >= bVar73) * bStack_d5f;
  uStack_1120._2_1_ = (bStack_d5e < bVar74) * bVar74 | (bStack_d5e >= bVar74) * bStack_d5e;
  uStack_1120._3_1_ = (bStack_d5d < bVar78) * bVar78 | (bStack_d5d >= bVar78) * bStack_d5d;
  uStack_1120._4_1_ = (bStack_d5c < bVar79) * bVar79 | (bStack_d5c >= bVar79) * bStack_d5c;
  uStack_1120._5_1_ = (bStack_d5b < bVar83) * bVar83 | (bStack_d5b >= bVar83) * bStack_d5b;
  uStack_1120._6_1_ = (bStack_d5a < bVar84) * bVar84 | (bStack_d5a >= bVar84) * bStack_d5a;
  uStack_1120._7_1_ = (bStack_d59 < bVar88) * bVar88 | (bStack_d59 >= bVar88) * bStack_d59;
  local_1128._0_2_ =
       CONCAT11((bVar49 < uStack_1120._1_1_) * uStack_1120._1_1_ |
                (bVar49 >= uStack_1120._1_1_) * bVar49,
                (bVar39 < (byte)uStack_1120) * (byte)uStack_1120 |
                (bVar39 >= (byte)uStack_1120) * bVar39);
  local_1128._0_3_ =
       CONCAT12((bVar50 < uStack_1120._2_1_) * uStack_1120._2_1_ |
                (bVar50 >= uStack_1120._2_1_) * bVar50,(undefined2)local_1128);
  local_1128._0_4_ =
       CONCAT13((bVar54 < uStack_1120._3_1_) * uStack_1120._3_1_ |
                (bVar54 >= uStack_1120._3_1_) * bVar54,(undefined3)local_1128);
  local_1128._0_5_ =
       CONCAT14((bVar55 < uStack_1120._4_1_) * uStack_1120._4_1_ |
                (bVar55 >= uStack_1120._4_1_) * bVar55,(undefined4)local_1128);
  local_1128._0_6_ =
       CONCAT15((bVar59 < uStack_1120._5_1_) * uStack_1120._5_1_ |
                (bVar59 >= uStack_1120._5_1_) * bVar59,(undefined5)local_1128);
  local_1128._0_7_ =
       CONCAT16((bVar60 < uStack_1120._6_1_) * uStack_1120._6_1_ |
                (bVar60 >= uStack_1120._6_1_) * bVar60,(undefined6)local_1128);
  local_1128 = CONCAT17((bVar64 < uStack_1120._7_1_) * uStack_1120._7_1_ |
                        (bVar64 >= uStack_1120._7_1_) * bVar64,(undefined7)local_1128);
  auVar17._8_8_ = uStack_1120;
  auVar17._0_8_ = local_1128;
  auVar16._8_8_ = uStack_1280;
  auVar16._0_8_ = local_1288;
  auVar47 = psubusb(auVar17,auVar16);
  local_e28 = auVar47[0];
  cStack_e27 = auVar47[1];
  cStack_e26 = auVar47[2];
  cStack_e25 = auVar47[3];
  cStack_e24 = auVar47[4];
  cStack_e23 = auVar47[5];
  cStack_e22 = auVar47[6];
  cStack_e21 = auVar47[7];
  local_e38 = (char)local_10f8;
  cStack_e37 = (char)((ulong)local_10f8 >> 8);
  cStack_e36 = (char)((ulong)local_10f8 >> 0x10);
  cStack_e35 = (char)((ulong)local_10f8 >> 0x18);
  cStack_e34 = (char)((ulong)local_10f8 >> 0x20);
  cStack_e33 = (char)((ulong)local_10f8 >> 0x28);
  cStack_e32 = (char)((ulong)local_10f8 >> 0x30);
  cStack_e31 = (char)((ulong)local_10f8 >> 0x38);
  cStack_e30 = (char)uStack_10f0;
  cStack_e2f = (char)((ulong)uStack_10f0 >> 8);
  cStack_e2e = (char)((ulong)uStack_10f0 >> 0x10);
  cStack_e2d = (char)((ulong)uStack_10f0 >> 0x18);
  cStack_e2c = (char)((ulong)uStack_10f0 >> 0x20);
  cStack_e2b = (char)((ulong)uStack_10f0 >> 0x28);
  cStack_e2a = (char)((ulong)uStack_10f0 >> 0x30);
  cStack_e29 = (char)((ulong)uStack_10f0 >> 0x38);
  local_1128._0_2_ = CONCAT11(-(cStack_e27 == cStack_e37),-(local_e28 == local_e38));
  local_1128._0_3_ = CONCAT12(-(cStack_e26 == cStack_e36),(undefined2)local_1128);
  local_1128._0_4_ = CONCAT13(-(cStack_e25 == cStack_e35),(undefined3)local_1128);
  local_1128._0_5_ = CONCAT14(-(cStack_e24 == cStack_e34),(undefined4)local_1128);
  local_1128._0_6_ = CONCAT15(-(cStack_e23 == cStack_e33),(undefined5)local_1128);
  local_1128._0_7_ = CONCAT16(-(cStack_e22 == cStack_e32),(undefined6)local_1128);
  local_1128 = CONCAT17(-(cStack_e21 == cStack_e31),(undefined7)local_1128);
  local_1128 = local_1128 & local_1108;
  local_e48 = (char)local_1128;
  cStack_e47 = (char)(local_1128 >> 8);
  cStack_e46 = (char)(local_1128 >> 0x10);
  cStack_e45 = (char)(local_1128 >> 0x18);
  cStack_e44 = (char)(local_1128 >> 0x20);
  cStack_e43 = (char)(local_1128 >> 0x28);
  cStack_e42 = (char)(local_1128 >> 0x30);
  cStack_e41 = (char)(local_1128 >> 0x38);
  auVar20[1] = -(cStack_e47 == cStack_e37);
  auVar20[0] = -(local_e48 == local_e38);
  auVar20[2] = -(cStack_e46 == cStack_e36);
  auVar20[3] = -(cStack_e45 == cStack_e35);
  auVar20[4] = -(cStack_e44 == cStack_e34);
  auVar20[5] = -(cStack_e43 == cStack_e33);
  auVar20[6] = -(cStack_e42 == cStack_e32);
  auVar20[7] = -(cStack_e41 == cStack_e31);
  auVar20[8] = -(local_e48 == cStack_e30);
  auVar20[9] = -(cStack_e47 == cStack_e2f);
  auVar20[10] = -(cStack_e46 == cStack_e2e);
  auVar20[0xb] = -(cStack_e45 == cStack_e2d);
  auVar20[0xc] = -(cStack_e44 == cStack_e2c);
  auVar20[0xd] = -(cStack_e43 == cStack_e2b);
  auVar20[0xe] = -(cStack_e42 == cStack_e2a);
  auVar20[0xf] = -(cStack_e41 == cStack_e29);
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
              (ushort)((byte)-(cStack_e41 == cStack_e29) >> 7) << 0xf) != 0xffff) {
    uVar72 = *local_1090;
    local_f78 = (undefined1)uVar72;
    uStack_f77 = (undefined1)(uVar72 >> 8);
    uStack_f76 = (undefined1)(uVar72 >> 0x10);
    uStack_f75 = (undefined1)(uVar72 >> 0x18);
    uStack_f74 = (undefined1)(uVar72 >> 0x20);
    uStack_f73 = (undefined1)(uVar72 >> 0x28);
    uStack_f72 = (undefined1)(uVar72 >> 0x30);
    uStack_f71 = (undefined1)(uVar72 >> 0x38);
    uVar72 = *local_10a0;
    local_f98 = (undefined1)uVar72;
    uStack_f97 = (undefined1)(uVar72 >> 8);
    uStack_f96 = (undefined1)(uVar72 >> 0x10);
    uStack_f95 = (undefined1)(uVar72 >> 0x18);
    uStack_f94 = (undefined1)(uVar72 >> 0x20);
    uStack_f93 = (undefined1)(uVar72 >> 0x28);
    uStack_f92 = (undefined1)(uVar72 >> 0x30);
    uStack_f91 = (undefined1)(uVar72 >> 0x38);
    uVar72 = *local_10b0;
    local_fb8 = (undefined1)uVar72;
    uStack_fb7 = (undefined1)(uVar72 >> 8);
    uStack_fb6 = (undefined1)(uVar72 >> 0x10);
    uStack_fb5 = (undefined1)(uVar72 >> 0x18);
    uStack_fb4 = (undefined1)(uVar72 >> 0x20);
    uStack_fb3 = (undefined1)(uVar72 >> 0x28);
    uStack_fb2 = (undefined1)(uVar72 >> 0x30);
    uStack_fb1 = (undefined1)(uVar72 >> 0x38);
    uVar72 = *local_10b8;
    local_fd8 = (undefined1)uVar72;
    uStack_fd7 = (undefined1)(uVar72 >> 8);
    uStack_fd6 = (undefined1)(uVar72 >> 0x10);
    uStack_fd5 = (undefined1)(uVar72 >> 0x18);
    uStack_fd4 = (undefined1)(uVar72 >> 0x20);
    uStack_fd3 = (undefined1)(uVar72 >> 0x28);
    uStack_fd2 = (undefined1)(uVar72 >> 0x30);
    uStack_fd1 = (undefined1)(uVar72 >> 0x38);
    uVar72 = *local_10a8;
    local_ff8 = (undefined1)uVar72;
    uStack_ff7 = (undefined1)(uVar72 >> 8);
    uStack_ff6 = (undefined1)(uVar72 >> 0x10);
    uStack_ff5 = (undefined1)(uVar72 >> 0x18);
    uStack_ff4 = (undefined1)(uVar72 >> 0x20);
    uStack_ff3 = (undefined1)(uVar72 >> 0x28);
    uStack_ff2 = (undefined1)(uVar72 >> 0x30);
    uStack_ff1 = (undefined1)(uVar72 >> 0x38);
    uVar72 = *local_1098;
    local_1018 = (undefined1)uVar72;
    uStack_1017 = (undefined1)(uVar72 >> 8);
    uStack_1016 = (undefined1)(uVar72 >> 0x10);
    uStack_1015 = (undefined1)(uVar72 >> 0x18);
    uStack_1014 = (undefined1)(uVar72 >> 0x20);
    uStack_1013 = (undefined1)(uVar72 >> 0x28);
    uStack_1012 = (undefined1)(uVar72 >> 0x30);
    uStack_1011 = (undefined1)(uVar72 >> 0x38);
    uVar1 = *local_1080;
    local_1038 = (undefined1)uVar1;
    uStack_1037 = (undefined1)((ulong)uVar1 >> 8);
    uStack_1036 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_1035 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_1034 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_1033 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_1032 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_1031 = (undefined1)((ulong)uVar1 >> 0x38);
    uVar1 = *local_1088;
    local_1058 = (undefined1)uVar1;
    uStack_1057 = (undefined1)((ulong)uVar1 >> 8);
    uStack_1056 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_1055 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_1054 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_1053 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_1052 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_1051 = (undefined1)((ulong)uVar1 >> 0x38);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_1037,CONCAT11(local_e38,local_1038)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_1036,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_1033,CONCAT11(cStack_e34,uStack_1034)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_1032,uVar9));
    sStack_666 = (short)((uint)uVar7 >> 0x10);
    sStack_664 = (short)((uint6)uVar8 >> 0x20);
    sStack_662 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_1035,uVar8)) >> 0x30);
    sStack_65e = (short)((uint)uVar9 >> 0x10);
    sStack_65c = (short)((uint6)uVar10 >> 0x20);
    sStack_65a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_1031,uVar10)) >> 0x30);
    uVar11 = CONCAT13(cStack_e37,CONCAT12(uStack_f77,CONCAT11(local_e38,local_f78)));
    uVar12 = CONCAT15(cStack_e36,CONCAT14(uStack_f76,uVar11));
    uVar13 = CONCAT13(cStack_e33,CONCAT12(uStack_f73,CONCAT11(cStack_e34,uStack_f74)));
    uVar14 = CONCAT15(cStack_e32,CONCAT14(uStack_f72,uVar13));
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_f97,CONCAT11(local_e38,local_f98)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_f96,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_f93,CONCAT11(cStack_e34,uStack_f94)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_f92,uVar9));
    sStack_686 = (short)((uint)uVar11 >> 0x10);
    sStack_684 = (short)((uint6)uVar12 >> 0x20);
    sStack_682 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_f75,uVar12)) >> 0x30);
    sStack_67e = (short)((uint)uVar13 >> 0x10);
    sStack_67c = (short)((uint6)uVar14 >> 0x20);
    sStack_67a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_f71,uVar14)) >> 0x30);
    sStack_696 = (short)((uint)uVar7 >> 0x10);
    sStack_694 = (short)((uint6)uVar8 >> 0x20);
    sStack_692 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_f95,uVar8)) >> 0x30);
    sStack_68e = (short)((uint)uVar9 >> 0x10);
    sStack_68c = (short)((uint6)uVar10 >> 0x20);
    sStack_68a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_f91,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_fb7,CONCAT11(local_e38,local_fb8)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_fb6,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_fb3,CONCAT11(cStack_e34,uStack_fb4)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_fb2,uVar9));
    sStack_6f6 = (short)((uint)uVar7 >> 0x10);
    sStack_6f4 = (short)((uint6)uVar8 >> 0x20);
    sStack_6f2 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_fb5,uVar8)) >> 0x30);
    sStack_6ee = (short)((uint)uVar9 >> 0x10);
    sStack_6ec = (short)((uint6)uVar10 >> 0x20);
    sStack_6ea = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_fb1,uVar10)) >> 0x30);
    sVar40 = CONCAT11(local_e38,local_1038) * 2 +
             CONCAT11(local_e38,local_f78) + CONCAT11(local_e38,local_f98) + 4 +
             CONCAT11(local_e38,local_fb8);
    sStack_6f6 = sStack_666 * 2 + sStack_686 + sStack_696 + 4 + sStack_6f6;
    sStack_6f4 = sStack_664 * 2 + sStack_684 + sStack_694 + 4 + sStack_6f4;
    sStack_6f2 = sStack_662 * 2 + sStack_682 + sStack_692 + 4 + sStack_6f2;
    sVar66 = CONCAT11(cStack_e34,uStack_1034) * 2 +
             CONCAT11(cStack_e34,uStack_f74) + CONCAT11(cStack_e34,uStack_f94) + 4 +
             CONCAT11(cStack_e34,uStack_fb4);
    sStack_6ee = sStack_65e * 2 + sStack_67e + sStack_68e + 4 + sStack_6ee;
    sStack_6ec = sStack_65c * 2 + sStack_67c + sStack_68c + 4 + sStack_6ec;
    sStack_6ea = sStack_65a * 2 + sStack_67a + sStack_68a + 4 + sStack_6ea;
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_fd7,CONCAT11(local_e38,local_fd8)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_fd6,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_fd3,CONCAT11(cStack_e34,uStack_fd4)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_fd2,uVar9));
    uVar11 = CONCAT13(cStack_e37,CONCAT12(uStack_f77,CONCAT11(local_e38,local_f78)));
    uVar12 = CONCAT15(cStack_e36,CONCAT14(uStack_f76,uVar11));
    uVar13 = CONCAT13(cStack_e33,CONCAT12(uStack_f73,CONCAT11(cStack_e34,uStack_f74)));
    uVar14 = CONCAT15(cStack_e32,CONCAT14(uStack_f72,uVar13));
    sStack_706 = (short)((uint)uVar7 >> 0x10);
    sStack_704 = (short)((uint6)uVar8 >> 0x20);
    sStack_702 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_fd5,uVar8)) >> 0x30);
    sStack_6fe = (short)((uint)uVar9 >> 0x10);
    sStack_6fc = (short)((uint6)uVar10 >> 0x20);
    sStack_6fa = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_fd1,uVar10)) >> 0x30);
    sStack_716 = (short)((uint)uVar11 >> 0x10);
    sStack_714 = (short)((uint6)uVar12 >> 0x20);
    sStack_712 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_f75,uVar12)) >> 0x30);
    sStack_70e = (short)((uint)uVar13 >> 0x10);
    sStack_70c = (short)((uint6)uVar14 >> 0x20);
    sStack_70a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_f71,uVar14)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_1037,CONCAT11(local_e38,local_1038)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_1036,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_1033,CONCAT11(cStack_e34,uStack_1034)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_1032,uVar9));
    sStack_736 = (short)((uint)uVar7 >> 0x10);
    sStack_734 = (short)((uint6)uVar8 >> 0x20);
    sStack_732 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_1035,uVar8)) >> 0x30);
    sStack_72e = (short)((uint)uVar9 >> 0x10);
    sStack_72c = (short)((uint6)uVar10 >> 0x20);
    sStack_72a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_1031,uVar10)) >> 0x30);
    uVar41 = (ushort)(sVar40 + CONCAT11(local_e38,local_fd8) + CONCAT11(local_e38,local_f78) +
                               CONCAT11(local_e38,local_1038)) >> 3;
    uVar51 = (ushort)(sStack_6f6 + sStack_706 + sStack_716 + sStack_736) >> 3;
    uVar56 = (ushort)(sStack_6f4 + sStack_704 + sStack_714 + sStack_734) >> 3;
    uVar61 = (ushort)(sStack_6f2 + sStack_702 + sStack_712 + sStack_732) >> 3;
    uVar67 = (ushort)(sVar66 + CONCAT11(cStack_e34,uStack_fd4) + CONCAT11(cStack_e34,uStack_f74) +
                               CONCAT11(cStack_e34,uStack_1034)) >> 3;
    uVar75 = (ushort)(sStack_6ee + sStack_6fe + sStack_70e + sStack_72e) >> 3;
    uVar80 = (ushort)(sStack_6ec + sStack_6fc + sStack_70c + sStack_72c) >> 3;
    uVar85 = (ushort)(sStack_6ea + sStack_6fa + sStack_70a + sStack_72a) >> 3;
    uVar11 = CONCAT13(cStack_e37,CONCAT12(uStack_fd7,CONCAT11(local_e38,local_fd8)));
    uVar12 = CONCAT15(cStack_e36,CONCAT14(uStack_fd6,uVar11));
    uVar13 = CONCAT13(cStack_e33,CONCAT12(uStack_fd3,CONCAT11(cStack_e34,uStack_fd4)));
    uVar14 = CONCAT15(cStack_e32,CONCAT14(uStack_fd2,uVar13));
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_ff7,CONCAT11(local_e38,local_ff8)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_ff6,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_ff3,CONCAT11(cStack_e34,uStack_ff4)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_ff2,uVar9));
    sStack_766 = (short)((uint)uVar11 >> 0x10);
    sStack_764 = (short)((uint6)uVar12 >> 0x20);
    sStack_762 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_fd5,uVar12)) >> 0x30);
    sStack_75e = (short)((uint)uVar13 >> 0x10);
    sStack_75c = (short)((uint6)uVar14 >> 0x20);
    sStack_75a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_fd1,uVar14)) >> 0x30);
    sStack_776 = (short)((uint)uVar7 >> 0x10);
    sStack_774 = (short)((uint6)uVar8 >> 0x20);
    sStack_772 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_ff5,uVar8)) >> 0x30);
    sStack_76e = (short)((uint)uVar9 >> 0x10);
    sStack_76c = (short)((uint6)uVar10 >> 0x20);
    sStack_76a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_ff1,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_f97,CONCAT11(local_e38,local_f98)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_f96,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_f93,CONCAT11(cStack_e34,uStack_f94)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_f92,uVar9));
    sStack_796 = (short)((uint)uVar7 >> 0x10);
    sStack_794 = (short)((uint6)uVar8 >> 0x20);
    sStack_792 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_f95,uVar8)) >> 0x30);
    sStack_78e = (short)((uint)uVar9 >> 0x10);
    sStack_78c = (short)((uint6)uVar10 >> 0x20);
    sStack_78a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_f91,uVar10)) >> 0x30);
    sVar42 = CONCAT11(local_e38,local_fd8) + CONCAT11(local_e38,local_ff8) +
             CONCAT11(local_e38,local_f98);
    sStack_796 = sStack_766 + sStack_776 + sStack_796;
    sStack_794 = sStack_764 + sStack_774 + sStack_794;
    sStack_792 = sStack_762 + sStack_772 + sStack_792;
    sVar68 = CONCAT11(cStack_e34,uStack_fd4) + CONCAT11(cStack_e34,uStack_ff4) +
             CONCAT11(cStack_e34,uStack_f94);
    sStack_78e = sStack_75e + sStack_76e + sStack_78e;
    sStack_78c = sStack_75c + sStack_76c + sStack_78c;
    sStack_78a = sStack_75a + sStack_76a + sStack_78a;
    uVar43 = (ushort)(sVar40 + sVar42) >> 3;
    uVar52 = (ushort)(sStack_6f6 + sStack_796) >> 3;
    uVar57 = (ushort)(sStack_6f4 + sStack_794) >> 3;
    uVar62 = (ushort)(sStack_6f2 + sStack_792) >> 3;
    uVar69 = (ushort)(sVar66 + sVar68) >> 3;
    uVar76 = (ushort)(sStack_6ee + sStack_78e) >> 3;
    uVar81 = (ushort)(sStack_6ec + sStack_78c) >> 3;
    uVar86 = (ushort)(sStack_6ea + sStack_78a) >> 3;
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_1037,CONCAT11(local_e38,local_1038)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_1036,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_1033,CONCAT11(cStack_e34,uStack_1034)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_1032,uVar9));
    sStack_576 = (short)((uint)uVar7 >> 0x10);
    sStack_574 = (short)((uint6)uVar8 >> 0x20);
    sStack_572 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_1035,uVar8)) >> 0x30);
    sStack_56e = (short)((uint)uVar9 >> 0x10);
    sStack_56c = (short)((uint6)uVar10 >> 0x20);
    sStack_56a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_1031,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_1017,CONCAT11(local_e38,local_1018)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_1016,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_1013,CONCAT11(cStack_e34,uStack_1014)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_1012,uVar9));
    sStack_7d6 = (short)((uint)uVar7 >> 0x10);
    sStack_7d4 = (short)((uint6)uVar8 >> 0x20);
    sStack_7d2 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_1015,uVar8)) >> 0x30);
    sStack_7ce = (short)((uint)uVar9 >> 0x10);
    sStack_7cc = (short)((uint6)uVar10 >> 0x20);
    sStack_7ca = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_1011,uVar10)) >> 0x30);
    sVar40 = (sVar40 - CONCAT11(local_e38,local_1038)) + CONCAT11(local_e38,local_1018);
    sStack_7d6 = (sStack_6f6 - sStack_576) + sStack_7d6;
    sStack_7d4 = (sStack_6f4 - sStack_574) + sStack_7d4;
    sStack_7d2 = (sStack_6f2 - sStack_572) + sStack_7d2;
    sVar66 = (sVar66 - CONCAT11(cStack_e34,uStack_1034)) + CONCAT11(cStack_e34,uStack_1014);
    sStack_7ce = (sStack_6ee - sStack_56e) + sStack_7ce;
    sStack_7cc = (sStack_6ec - sStack_56c) + sStack_7cc;
    sStack_7ca = (sStack_6ea - sStack_56a) + sStack_7ca;
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_f97,CONCAT11(local_e38,local_f98)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_f96,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_f93,CONCAT11(cStack_e34,uStack_f94)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_f92,uVar9));
    sStack_596 = (short)((uint)uVar7 >> 0x10);
    sStack_594 = (short)((uint6)uVar8 >> 0x20);
    sStack_592 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_f95,uVar8)) >> 0x30);
    sStack_58e = (short)((uint)uVar9 >> 0x10);
    sStack_58c = (short)((uint6)uVar10 >> 0x20);
    sStack_58a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_f91,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_fb7,CONCAT11(local_e38,local_fb8)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_fb6,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_fb3,CONCAT11(cStack_e34,uStack_fb4)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_fb2,uVar9));
    sStack_7f6 = (short)((uint)uVar7 >> 0x10);
    sStack_7f4 = (short)((uint6)uVar8 >> 0x20);
    sStack_7f2 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_fb5,uVar8)) >> 0x30);
    sStack_7ee = (short)((uint)uVar9 >> 0x10);
    sStack_7ec = (short)((uint6)uVar10 >> 0x20);
    sStack_7ea = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_fb1,uVar10)) >> 0x30);
    sVar42 = (sVar42 - CONCAT11(local_e38,local_f98)) + CONCAT11(local_e38,local_fb8);
    sStack_7f6 = (sStack_796 - sStack_596) + sStack_7f6;
    sStack_7f4 = (sStack_794 - sStack_594) + sStack_7f4;
    sStack_7f2 = (sStack_792 - sStack_592) + sStack_7f2;
    sVar68 = (sVar68 - CONCAT11(cStack_e34,uStack_f94)) + CONCAT11(cStack_e34,uStack_fb4);
    sStack_7ee = (sStack_78e - sStack_58e) + sStack_7ee;
    sStack_7ec = (sStack_78c - sStack_58c) + sStack_7ec;
    sStack_7ea = (sStack_78a - sStack_58a) + sStack_7ea;
    uVar44 = (ushort)(sVar40 + sVar42) >> 3;
    uVar53 = (ushort)(sStack_7d6 + sStack_7f6) >> 3;
    uVar58 = (ushort)(sStack_7d4 + sStack_7f4) >> 3;
    uVar63 = (ushort)(sStack_7d2 + sStack_7f2) >> 3;
    uVar70 = (ushort)(sVar66 + sVar68) >> 3;
    uVar77 = (ushort)(sStack_7ce + sStack_7ee) >> 3;
    uVar82 = (ushort)(sStack_7cc + sStack_7ec) >> 3;
    uVar87 = (ushort)(sStack_7ca + sStack_7ea) >> 3;
    local_11c8 = (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
    cStack_11c7 = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
    cStack_11c6 = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
    cStack_11c5 = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
    cStack_11c4 = (uVar70 != 0) * (uVar70 < 0x100) * (char)uVar70 - (0xff < uVar70);
    cStack_11c3 = (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77);
    cStack_11c2 = (uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82);
    cStack_11c1 = (uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87);
    cStack_11c0 = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
    cStack_11bf = (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
    cStack_11be = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
    cStack_11bd = (uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 - (0xff < uVar62);
    cStack_11bc = (uVar69 != 0) * (uVar69 < 0x100) * (char)uVar69 - (0xff < uVar69);
    cStack_11bb = (uVar76 != 0) * (uVar76 < 0x100) * (char)uVar76 - (0xff < uVar76);
    cStack_11ba = (uVar81 != 0) * (uVar81 < 0x100) * (char)uVar81 - (0xff < uVar81);
    cStack_11b9 = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_1037,CONCAT11(local_e38,local_1038)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_1036,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_1033,CONCAT11(cStack_e34,uStack_1034)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_1032,uVar9));
    sStack_5b6 = (short)((uint)uVar7 >> 0x10);
    sStack_5b4 = (short)((uint6)uVar8 >> 0x20);
    sStack_5b2 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_1035,uVar8)) >> 0x30);
    sStack_5ae = (short)((uint)uVar9 >> 0x10);
    sStack_5ac = (short)((uint6)uVar10 >> 0x20);
    sStack_5aa = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_1031,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_1057,CONCAT11(local_e38,local_1058)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_1056,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_1053,CONCAT11(cStack_e34,uStack_1054)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_1052,uVar9));
    sStack_836 = (short)((uint)uVar7 >> 0x10);
    sStack_834 = (short)((uint6)uVar8 >> 0x20);
    sStack_832 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_1055,uVar8)) >> 0x30);
    sStack_82e = (short)((uint)uVar9 >> 0x10);
    sStack_82c = (short)((uint6)uVar10 >> 0x20);
    sStack_82a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_1051,uVar10)) >> 0x30);
    sVar40 = (sVar40 - CONCAT11(local_e38,local_1038)) + CONCAT11(local_e38,local_1058);
    sStack_836 = (sStack_7d6 - sStack_5b6) + sStack_836;
    sStack_834 = (sStack_7d4 - sStack_5b4) + sStack_834;
    sStack_832 = (sStack_7d2 - sStack_5b2) + sStack_832;
    sVar66 = (sVar66 - CONCAT11(cStack_e34,uStack_1034)) + CONCAT11(cStack_e34,uStack_1054);
    sStack_82e = (sStack_7ce - sStack_5ae) + sStack_82e;
    sStack_82c = (sStack_7cc - sStack_5ac) + sStack_82c;
    sStack_82a = (sStack_7ca - sStack_5aa) + sStack_82a;
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_fb7,CONCAT11(local_e38,local_fb8)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_fb6,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_fb3,CONCAT11(cStack_e34,uStack_fb4)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_fb2,uVar9));
    sStack_5d6 = (short)((uint)uVar7 >> 0x10);
    sStack_5d4 = (short)((uint6)uVar8 >> 0x20);
    sStack_5d2 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_fb5,uVar8)) >> 0x30);
    sStack_5ce = (short)((uint)uVar9 >> 0x10);
    sStack_5cc = (short)((uint6)uVar10 >> 0x20);
    sStack_5ca = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_fb1,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_fd7,CONCAT11(local_e38,local_fd8)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_fd6,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_fd3,CONCAT11(cStack_e34,uStack_fd4)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_fd2,uVar9));
    sStack_856 = (short)((uint)uVar7 >> 0x10);
    sStack_854 = (short)((uint6)uVar8 >> 0x20);
    sStack_852 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_fd5,uVar8)) >> 0x30);
    sStack_84e = (short)((uint)uVar9 >> 0x10);
    sStack_84c = (short)((uint6)uVar10 >> 0x20);
    sStack_84a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_fd1,uVar10)) >> 0x30);
    sVar42 = (sVar42 - CONCAT11(local_e38,local_fb8)) + CONCAT11(local_e38,local_fd8);
    sStack_856 = (sStack_7f6 - sStack_5d6) + sStack_856;
    sStack_854 = (sStack_7f4 - sStack_5d4) + sStack_854;
    sStack_852 = (sStack_7f2 - sStack_5d2) + sStack_852;
    sVar68 = (sVar68 - CONCAT11(cStack_e34,uStack_fb4)) + CONCAT11(cStack_e34,uStack_fd4);
    sStack_84e = (sStack_7ee - sStack_5ce) + sStack_84e;
    sStack_84c = (sStack_7ec - sStack_5cc) + sStack_84c;
    sStack_84a = (sStack_7ea - sStack_5ca) + sStack_84a;
    uVar43 = (ushort)(sVar40 + sVar42) >> 3;
    uVar52 = (ushort)(sStack_836 + sStack_856) >> 3;
    uVar57 = (ushort)(sStack_834 + sStack_854) >> 3;
    uVar62 = (ushort)(sStack_832 + sStack_852) >> 3;
    uVar69 = (ushort)(sVar66 + sVar68) >> 3;
    uVar76 = (ushort)(sStack_82e + sStack_84e) >> 3;
    uVar81 = (ushort)(sStack_82c + sStack_84c) >> 3;
    uVar86 = (ushort)(sStack_82a + sStack_84a) >> 3;
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_f77,CONCAT11(local_e38,local_f78)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_f76,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_f73,CONCAT11(cStack_e34,uStack_f74)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_f72,uVar9));
    sStack_5f6 = (short)((uint)uVar7 >> 0x10);
    sStack_5f4 = (short)((uint6)uVar8 >> 0x20);
    sStack_5f2 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_f75,uVar8)) >> 0x30);
    sStack_5ee = (short)((uint)uVar9 >> 0x10);
    sStack_5ec = (short)((uint6)uVar10 >> 0x20);
    sStack_5ea = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_f71,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_1057,CONCAT11(local_e38,local_1058)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_1056,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_1053,CONCAT11(cStack_e34,uStack_1054)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_1052,uVar9));
    sStack_896 = (short)((uint)uVar7 >> 0x10);
    sStack_894 = (short)((uint6)uVar8 >> 0x20);
    sStack_892 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_1055,uVar8)) >> 0x30);
    sStack_88e = (short)((uint)uVar9 >> 0x10);
    sStack_88c = (short)((uint6)uVar10 >> 0x20);
    sStack_88a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_1051,uVar10)) >> 0x30);
    sVar40 = (sVar40 - CONCAT11(local_e38,local_f78)) + CONCAT11(local_e38,local_1058);
    sStack_896 = (sStack_836 - sStack_5f6) + sStack_896;
    sStack_894 = (sStack_834 - sStack_5f4) + sStack_894;
    sStack_892 = (sStack_832 - sStack_5f2) + sStack_892;
    sVar66 = (sVar66 - CONCAT11(cStack_e34,uStack_f74)) + CONCAT11(cStack_e34,uStack_1054);
    sStack_88e = (sStack_82e - sStack_5ee) + sStack_88e;
    sStack_88c = (sStack_82c - sStack_5ec) + sStack_88c;
    sStack_88a = (sStack_82a - sStack_5ea) + sStack_88a;
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_fd7,CONCAT11(local_e38,local_fd8)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_fd6,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_fd3,CONCAT11(cStack_e34,uStack_fd4)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_fd2,uVar9));
    sStack_616 = (short)((uint)uVar7 >> 0x10);
    sStack_614 = (short)((uint6)uVar8 >> 0x20);
    sStack_612 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_fd5,uVar8)) >> 0x30);
    sStack_60e = (short)((uint)uVar9 >> 0x10);
    sStack_60c = (short)((uint6)uVar10 >> 0x20);
    sStack_60a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_fd1,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_ff7,CONCAT11(local_e38,local_ff8)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_ff6,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_ff3,CONCAT11(cStack_e34,uStack_ff4)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_ff2,uVar9));
    sStack_8b6 = (short)((uint)uVar7 >> 0x10);
    sStack_8b4 = (short)((uint6)uVar8 >> 0x20);
    sStack_8b2 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_ff5,uVar8)) >> 0x30);
    sStack_8ae = (short)((uint)uVar9 >> 0x10);
    sStack_8ac = (short)((uint6)uVar10 >> 0x20);
    sStack_8aa = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_ff1,uVar10)) >> 0x30);
    sVar42 = (sVar42 - CONCAT11(local_e38,local_fd8)) + CONCAT11(local_e38,local_ff8);
    sStack_8b6 = (sStack_856 - sStack_616) + sStack_8b6;
    sStack_8b4 = (sStack_854 - sStack_614) + sStack_8b4;
    sStack_8b2 = (sStack_852 - sStack_612) + sStack_8b2;
    sVar68 = (sVar68 - CONCAT11(cStack_e34,uStack_fd4)) + CONCAT11(cStack_e34,uStack_ff4);
    sStack_8ae = (sStack_84e - sStack_60e) + sStack_8ae;
    sStack_8ac = (sStack_84c - sStack_60c) + sStack_8ac;
    sStack_8aa = (sStack_84a - sStack_60a) + sStack_8aa;
    uVar44 = (ushort)(sVar40 + sVar42) >> 3;
    uVar53 = (ushort)(sStack_896 + sStack_8b6) >> 3;
    uVar58 = (ushort)(sStack_894 + sStack_8b4) >> 3;
    uVar63 = (ushort)(sStack_892 + sStack_8b2) >> 3;
    uVar70 = (ushort)(sVar66 + sVar68) >> 3;
    uVar77 = (ushort)(sStack_88e + sStack_8ae) >> 3;
    uVar82 = (ushort)(sStack_88c + sStack_8ac) >> 3;
    uVar87 = (ushort)(sStack_88a + sStack_8aa) >> 3;
    local_11d8 = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
    cStack_11d7 = (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
    cStack_11d6 = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
    cStack_11d5 = (uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 - (0xff < uVar62);
    cStack_11d4 = (uVar69 != 0) * (uVar69 < 0x100) * (char)uVar69 - (0xff < uVar69);
    cStack_11d3 = (uVar76 != 0) * (uVar76 < 0x100) * (char)uVar76 - (0xff < uVar76);
    cStack_11d2 = (uVar81 != 0) * (uVar81 < 0x100) * (char)uVar81 - (0xff < uVar81);
    cStack_11d1 = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
    cStack_11d0 = (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
    cStack_11cf = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
    cStack_11ce = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
    cStack_11cd = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
    cStack_11cc = (uVar70 != 0) * (uVar70 < 0x100) * (char)uVar70 - (0xff < uVar70);
    cStack_11cb = (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77);
    cStack_11ca = (uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82);
    cStack_11c9 = (uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_f97,CONCAT11(local_e38,local_f98)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_f96,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_f93,CONCAT11(cStack_e34,uStack_f94)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_f92,uVar9));
    sStack_636 = (short)((uint)uVar7 >> 0x10);
    sStack_634 = (short)((uint6)uVar8 >> 0x20);
    sStack_632 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_f95,uVar8)) >> 0x30);
    sStack_62e = (short)((uint)uVar9 >> 0x10);
    sStack_62c = (short)((uint6)uVar10 >> 0x20);
    sStack_62a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_f91,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_1057,CONCAT11(local_e38,local_1058)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_1056,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_1053,CONCAT11(cStack_e34,uStack_1054)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_1052,uVar9));
    sStack_8f6 = (short)((uint)uVar7 >> 0x10);
    sStack_8f4 = (short)((uint6)uVar8 >> 0x20);
    sStack_8f2 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_1055,uVar8)) >> 0x30);
    sStack_8ee = (short)((uint)uVar9 >> 0x10);
    sStack_8ec = (short)((uint6)uVar10 >> 0x20);
    sStack_8ea = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_1051,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_ff7,CONCAT11(local_e38,local_ff8)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_ff6,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_ff3,CONCAT11(cStack_e34,uStack_ff4)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_ff2,uVar9));
    sStack_656 = (short)((uint)uVar7 >> 0x10);
    sStack_654 = (short)((uint6)uVar8 >> 0x20);
    sStack_652 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_ff5,uVar8)) >> 0x30);
    sStack_64e = (short)((uint)uVar9 >> 0x10);
    sStack_64c = (short)((uint6)uVar10 >> 0x20);
    sStack_64a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_ff1,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_e37,CONCAT12(uStack_1017,CONCAT11(local_e38,local_1018)));
    uVar8 = CONCAT15(cStack_e36,CONCAT14(uStack_1016,uVar7));
    uVar9 = CONCAT13(cStack_e33,CONCAT12(uStack_1013,CONCAT11(cStack_e34,uStack_1014)));
    uVar10 = CONCAT15(cStack_e32,CONCAT14(uStack_1012,uVar9));
    sStack_916 = (short)((uint)uVar7 >> 0x10);
    sStack_914 = (short)((uint6)uVar8 >> 0x20);
    sStack_912 = (short)(CONCAT17(cStack_e35,CONCAT16(uStack_1015,uVar8)) >> 0x30);
    sStack_90e = (short)((uint)uVar9 >> 0x10);
    sStack_90c = (short)((uint6)uVar10 >> 0x20);
    sStack_90a = (short)(CONCAT17(cStack_e31,CONCAT16(uStack_1011,uVar10)) >> 0x30);
    uVar43 = (ushort)((sVar40 - CONCAT11(local_e38,local_f98)) + CONCAT11(local_e38,local_1058) +
                     (sVar42 - CONCAT11(local_e38,local_ff8)) + CONCAT11(local_e38,local_1018)) >> 3
    ;
    uVar44 = (ushort)((sStack_896 - sStack_636) + sStack_8f6 +
                     (sStack_8b6 - sStack_656) + sStack_916) >> 3;
    uVar52 = (ushort)((sStack_894 - sStack_634) + sStack_8f4 +
                     (sStack_8b4 - sStack_654) + sStack_914) >> 3;
    uVar53 = (ushort)((sStack_892 - sStack_632) + sStack_8f2 +
                     (sStack_8b2 - sStack_652) + sStack_912) >> 3;
    uVar57 = (ushort)((sVar66 - CONCAT11(cStack_e34,uStack_f94)) + CONCAT11(cStack_e34,uStack_1054)
                     + (sVar68 - CONCAT11(cStack_e34,uStack_ff4)) + CONCAT11(cStack_e34,uStack_1014)
                     ) >> 3;
    uVar58 = (ushort)((sStack_88e - sStack_62e) + sStack_8ee +
                     (sStack_8ae - sStack_64e) + sStack_90e) >> 3;
    uVar62 = (ushort)((sStack_88c - sStack_62c) + sStack_8ec +
                     (sStack_8ac - sStack_64c) + sStack_90c) >> 3;
    uVar63 = (ushort)((sStack_88a - sStack_62a) + sStack_8ea +
                     (sStack_8aa - sStack_64a) + sStack_90a) >> 3;
    uVar72 = ~local_1128;
    uVar45 = local_1128 &
             CONCAT17((uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63),
                      CONCAT16((uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 - (0xff < uVar62),
                               CONCAT15((uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 -
                                        (0xff < uVar58),
                                        CONCAT14((uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 -
                                                 (0xff < uVar57),
                                                 CONCAT13((uVar53 != 0) * (uVar53 < 0x100) *
                                                          (char)uVar53 - (0xff < uVar53),
                                                          CONCAT12((uVar52 != 0) * (uVar52 < 0x100)
                                                                   * (char)uVar52 - (0xff < uVar52),
                                                                   CONCAT11((uVar44 != 0) *
                                                                            (uVar44 < 0x100) *
                                                                            (char)uVar44 -
                                                                            (0xff < uVar44),
                                                                            (uVar43 != 0) *
                                                                            (uVar43 < 0x100) *
                                                                            (char)uVar43 -
                                                                            (0xff < uVar43))))))));
    uStack_1120 = local_1128;
    *local_1090 = ~local_1128 & local_11e8 |
                  local_1128 &
                  CONCAT17((uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 - (0xff < uVar85),
                           CONCAT16((uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 -
                                    (0xff < uVar80),
                                    CONCAT15((uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 -
                                             (0xff < uVar75),
                                             CONCAT14((uVar67 != 0) * (uVar67 < 0x100) *
                                                      (char)uVar67 - (0xff < uVar67),
                                                      CONCAT13((uVar61 != 0) * (uVar61 < 0x100) *
                                                               (char)uVar61 - (0xff < uVar61),
                                                               CONCAT12((uVar56 != 0) *
                                                                        (uVar56 < 0x100) *
                                                                        (char)uVar56 -
                                                                        (0xff < uVar56),
                                                                        CONCAT11((uVar51 != 0) *
                                                                                 (uVar51 < 0x100) *
                                                                                 (char)uVar51 -
                                                                                 (0xff < uVar51),
                                                                                 (uVar41 != 0) *
                                                                                 (uVar41 < 0x100) *
                                                                                 (char)uVar41 -
                                                                                 (0xff < uVar41)))))
                                            )));
    puVar38[1] = uVar72 & uStack_11e0 | uVar45;
    *local_1098 = local_1090[1];
    local_1098[1] = 0;
    uVar72 = ~uStack_1120;
    uVar45 = uStack_1120 &
             CONCAT17(cStack_11c9,
                      CONCAT16(cStack_11ca,
                               CONCAT15(cStack_11cb,
                                        CONCAT14(cStack_11cc,
                                                 CONCAT13(cStack_11cd,
                                                          CONCAT12(cStack_11ce,
                                                                   CONCAT11(cStack_11cf,cStack_11d0)
                                                                  ))))));
    *local_10c0 = ~local_1128 & *local_10c0 |
                  local_1128 &
                  CONCAT17(cStack_11d1,
                           CONCAT16(cStack_11d2,
                                    CONCAT15(cStack_11d3,
                                             CONCAT14(cStack_11d4,
                                                      CONCAT13(cStack_11d5,
                                                               CONCAT12(cStack_11d6,
                                                                        CONCAT11(cStack_11d7,
                                                                                 local_11d8)))))));
    local_10c0[1] = uVar72 & local_10c0[1] | uVar45;
    local_998 = (uint)local_1128;
    uStack_994 = (uint)(local_1128 >> 0x20);
    uStack_990 = (uint)uStack_1120;
    uStack_98c = (uint)(uStack_1120 >> 0x20);
    local_9a8 = (uint)*local_10c8;
    uStack_9a4 = (uint)(*local_10c8 >> 0x20);
    uStack_9a0 = (uint)local_10c8[1];
    uStack_99c = (uint)(local_10c8[1] >> 0x20);
    *local_10c8 = CONCAT44((uStack_994 ^ 0xffffffff) & uStack_9a4,
                           (local_998 ^ 0xffffffff) & local_9a8) |
                  local_1128 &
                  CONCAT17(cStack_11c1,
                           CONCAT16(cStack_11c2,
                                    CONCAT15(cStack_11c3,
                                             CONCAT14(cStack_11c4,
                                                      CONCAT13(cStack_11c5,
                                                               CONCAT12(cStack_11c6,
                                                                        CONCAT11(cStack_11c7,
                                                                                 local_11c8)))))));
    local_10c8[1] =
         CONCAT44((uStack_98c ^ 0xffffffff) & uStack_99c,(uStack_990 ^ 0xffffffff) & uStack_9a0) |
         uStack_1120 &
         CONCAT17(cStack_11b9,
                  CONCAT16(cStack_11ba,
                           CONCAT15(cStack_11bb,
                                    CONCAT14(cStack_11bc,
                                             CONCAT13(cStack_11bd,
                                                      CONCAT12(cStack_11be,
                                                               CONCAT11(cStack_11bf,cStack_11c0)))))
                          ));
  }
  *(ulong *)((long)local_15b0 - (long)local_15b4) = local_16a8;
  *(undefined8 *)((long)local_15b0 - (long)(local_15b4 * 2)) = uStack_16a0;
  *local_15b0 = local_1698;
  *(undefined8 *)((long)local_15b0 + (long)local_15b4) = uStack_1690;
  *(ulong *)((long)local_15b0 - (long)(local_15b4 * 3)) = local_1628[2];
  *(ulong *)((long)local_15b0 + (long)(local_15b4 * 2)) = local_1668[0];
  return;
}

Assistant:

void aom_lpf_horizontal_8_dual_sse2(uint8_t *s, int p, const uint8_t *_blimit0,
                                    const uint8_t *_limit0,
                                    const uint8_t *_thresh0,
                                    const uint8_t *_blimit1,
                                    const uint8_t *_limit1,
                                    const uint8_t *_thresh1) {
  __m128i blimit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_blimit0),
                                      _mm_load_si128((__m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_limit0),
                                     _mm_load_si128((__m128i *)_limit1));
  __m128i thresh = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_thresh0),
                                      _mm_load_si128((__m128i *)_thresh1));

  __m128i p2, p1, p0, q0, q1, q2, p3, q3;
  __m128i q1q0, p1p0;

  p3 = _mm_loadl_epi64((__m128i *)(s - 4 * p));
  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s - 0 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));
  q3 = _mm_loadl_epi64((__m128i *)(s + 3 * p));

  lpf_internal_8_dual_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0, &q1q0, &p1p0,
                           &blimit, &limit, &thresh);

  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
  _mm_storel_epi64((__m128i *)(s - 3 * p), p2);
  _mm_storel_epi64((__m128i *)(s + 2 * p), q2);
}